

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

bool embree::avx2::CurveNvIntersectorK<4,4>::
     occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx2::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [28];
  float *pfVar3;
  float *pfVar4;
  uint uVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  Primitive PVar8;
  uint uVar9;
  int iVar10;
  RTCFilterFunctionN p_Var11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  ulong uVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [28];
  undefined4 uVar73;
  ulong uVar74;
  Geometry *pGVar75;
  RTCIntersectArguments *pRVar76;
  ulong uVar77;
  uint uVar78;
  ulong uVar79;
  ulong uVar80;
  long lVar81;
  long lVar82;
  undefined8 uVar83;
  float fVar98;
  vint4 bi_2;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  float fVar97;
  float fVar99;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar88 [16];
  undefined1 auVar96 [32];
  undefined8 uVar103;
  vint4 bi_1;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar106 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar117;
  undefined1 auVar116 [64];
  float fVar118;
  float fVar119;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar129 [32];
  undefined1 auVar124 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [64];
  float fVar133;
  float fVar141;
  vint4 ai_2;
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [64];
  vint4 ai;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  vint4 bi;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  vint4 ai_1;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar174 [32];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [64];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar175 [64];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [64];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined4 uVar189;
  undefined1 auVar190 [16];
  undefined1 auVar191 [64];
  float fVar197;
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar198 [64];
  float fVar205;
  float fVar206;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar208;
  float fVar209;
  float fVar210;
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar207;
  undefined1 auVar204 [64];
  RTCFilterFunctionNArguments args;
  float local_800;
  float fStack_7fc;
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  undefined1 local_740 [16];
  ulong local_728;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined1 local_620 [32];
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  undefined1 (*local_5d8) [16];
  RTCFilterFunctionNArguments local_5d0;
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  undefined8 uStack_578;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [32];
  undefined1 local_530 [8];
  undefined4 uStack_528;
  undefined4 uStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined4 uStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  long local_4f0;
  ulong local_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined4 local_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  undefined4 local_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined1 local_3d0 [16];
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  int local_1c0;
  int local_1bc;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  float local_140 [4];
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar179 [16];
  
  PVar8 = prim[1];
  uVar74 = (ulong)(byte)PVar8;
  fVar119 = *(float *)(prim + uVar74 * 0x19 + 0x12);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar12 = vsubps_avx(auVar12,*(undefined1 (*) [16])(prim + uVar74 * 0x19 + 6));
  auVar84._0_4_ = fVar119 * auVar12._0_4_;
  auVar84._4_4_ = fVar119 * auVar12._4_4_;
  auVar84._8_4_ = fVar119 * auVar12._8_4_;
  auVar84._12_4_ = fVar119 * auVar12._12_4_;
  auVar151._0_4_ = fVar119 * auVar13._0_4_;
  auVar151._4_4_ = fVar119 * auVar13._4_4_;
  auVar151._8_4_ = fVar119 * auVar13._8_4_;
  auVar151._12_4_ = fVar119 * auVar13._12_4_;
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 4 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 5 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 6 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0xb + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0xc + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0xd + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0x12 + 6)));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar86 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0x13 + 6)));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar191 = ZEXT1664(auVar86);
  auVar120 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0x14 + 6)));
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar199._4_4_ = auVar151._0_4_;
  auVar199._0_4_ = auVar151._0_4_;
  auVar199._8_4_ = auVar151._0_4_;
  auVar199._12_4_ = auVar151._0_4_;
  auVar105 = vshufps_avx(auVar151,auVar151,0x55);
  auVar85 = vshufps_avx(auVar151,auVar151,0xaa);
  fVar119 = auVar85._0_4_;
  auVar186._0_4_ = fVar119 * auVar15._0_4_;
  fVar118 = auVar85._4_4_;
  auVar186._4_4_ = fVar118 * auVar15._4_4_;
  fVar97 = auVar85._8_4_;
  auVar186._8_4_ = fVar97 * auVar15._8_4_;
  fVar98 = auVar85._12_4_;
  auVar186._12_4_ = fVar98 * auVar15._12_4_;
  auVar178._0_4_ = auVar18._0_4_ * fVar119;
  auVar178._4_4_ = auVar18._4_4_ * fVar118;
  auVar178._8_4_ = auVar18._8_4_ * fVar97;
  auVar178._12_4_ = auVar18._12_4_ * fVar98;
  auVar170._0_4_ = auVar120._0_4_ * fVar119;
  auVar170._4_4_ = auVar120._4_4_ * fVar118;
  auVar170._8_4_ = auVar120._8_4_ * fVar97;
  auVar170._12_4_ = auVar120._12_4_ * fVar98;
  auVar85 = vfmadd231ps_fma(auVar186,auVar105,auVar13);
  auVar121 = vfmadd231ps_fma(auVar178,auVar105,auVar17);
  auVar105 = vfmadd231ps_fma(auVar170,auVar86,auVar105);
  auVar134 = vfmadd231ps_fma(auVar85,auVar199,auVar12);
  auVar121 = vfmadd231ps_fma(auVar121,auVar199,auVar16);
  auVar143 = vfmadd231ps_fma(auVar105,auVar87,auVar199);
  auVar200._4_4_ = auVar84._0_4_;
  auVar200._0_4_ = auVar84._0_4_;
  auVar200._8_4_ = auVar84._0_4_;
  auVar200._12_4_ = auVar84._0_4_;
  auVar105 = vshufps_avx(auVar84,auVar84,0x55);
  auVar85 = vshufps_avx(auVar84,auVar84,0xaa);
  fVar119 = auVar85._0_4_;
  auVar152._0_4_ = fVar119 * auVar15._0_4_;
  fVar118 = auVar85._4_4_;
  auVar152._4_4_ = fVar118 * auVar15._4_4_;
  fVar97 = auVar85._8_4_;
  auVar152._8_4_ = fVar97 * auVar15._8_4_;
  fVar98 = auVar85._12_4_;
  auVar152._12_4_ = fVar98 * auVar15._12_4_;
  auVar104._0_4_ = auVar18._0_4_ * fVar119;
  auVar104._4_4_ = auVar18._4_4_ * fVar118;
  auVar104._8_4_ = auVar18._8_4_ * fVar97;
  auVar104._12_4_ = auVar18._12_4_ * fVar98;
  auVar85._0_4_ = auVar120._0_4_ * fVar119;
  auVar85._4_4_ = auVar120._4_4_ * fVar118;
  auVar85._8_4_ = auVar120._8_4_ * fVar97;
  auVar85._12_4_ = auVar120._12_4_ * fVar98;
  auVar13 = vfmadd231ps_fma(auVar152,auVar105,auVar13);
  auVar15 = vfmadd231ps_fma(auVar104,auVar105,auVar17);
  auVar17 = vfmadd231ps_fma(auVar85,auVar105,auVar86);
  auVar18 = vfmadd231ps_fma(auVar13,auVar200,auVar12);
  auVar86 = vfmadd231ps_fma(auVar15,auVar200,auVar16);
  auVar120 = vfmadd231ps_fma(auVar17,auVar200,auVar87);
  local_290._8_4_ = 0x7fffffff;
  local_290._0_8_ = 0x7fffffff7fffffff;
  local_290._12_4_ = 0x7fffffff;
  auVar12 = vandps_avx(auVar134,local_290);
  auVar142._8_4_ = 0x219392ef;
  auVar142._0_8_ = 0x219392ef219392ef;
  auVar142._12_4_ = 0x219392ef;
  auVar12 = vcmpps_avx(auVar12,auVar142,1);
  auVar13 = vblendvps_avx(auVar134,auVar142,auVar12);
  auVar12 = vandps_avx(auVar121,local_290);
  auVar12 = vcmpps_avx(auVar12,auVar142,1);
  auVar15 = vblendvps_avx(auVar121,auVar142,auVar12);
  auVar12 = vandps_avx(local_290,auVar143);
  auVar12 = vcmpps_avx(auVar12,auVar142,1);
  auVar12 = vblendvps_avx(auVar143,auVar142,auVar12);
  auVar16 = vrcpps_avx(auVar13);
  auVar171._8_4_ = 0x3f800000;
  auVar171._0_8_ = 0x3f8000003f800000;
  auVar171._12_4_ = 0x3f800000;
  auVar13 = vfnmadd213ps_fma(auVar13,auVar16,auVar171);
  auVar16 = vfmadd132ps_fma(auVar13,auVar16,auVar16);
  auVar13 = vrcpps_avx(auVar15);
  auVar15 = vfnmadd213ps_fma(auVar15,auVar13,auVar171);
  auVar17 = vfmadd132ps_fma(auVar15,auVar13,auVar13);
  auVar13 = vrcpps_avx(auVar12);
  auVar15 = vfnmadd213ps_fma(auVar12,auVar13,auVar171);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar74 * 7 + 6);
  auVar12 = vpmovsxwd_avx(auVar12);
  auVar87 = vfmadd132ps_fma(auVar15,auVar13,auVar13);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar18);
  auVar143._0_4_ = auVar16._0_4_ * auVar12._0_4_;
  auVar143._4_4_ = auVar16._4_4_ * auVar12._4_4_;
  auVar143._8_4_ = auVar16._8_4_ * auVar12._8_4_;
  auVar143._12_4_ = auVar16._12_4_ * auVar12._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar74 * 9 + 6);
  auVar12 = vpmovsxwd_avx(auVar13);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vsubps_avx(auVar12,auVar18);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar74 * 0xe + 6);
  auVar12 = vpmovsxwd_avx(auVar15);
  auVar153._0_4_ = auVar16._0_4_ * auVar13._0_4_;
  auVar153._4_4_ = auVar16._4_4_ * auVar13._4_4_;
  auVar153._8_4_ = auVar16._8_4_ * auVar13._8_4_;
  auVar153._12_4_ = auVar16._12_4_ * auVar13._12_4_;
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar86);
  auVar161._0_4_ = auVar17._0_4_ * auVar12._0_4_;
  auVar161._4_4_ = auVar17._4_4_ * auVar12._4_4_;
  auVar161._8_4_ = auVar17._8_4_ * auVar12._8_4_;
  auVar161._12_4_ = auVar17._12_4_ * auVar12._12_4_;
  auVar121._1_3_ = 0;
  auVar121[0] = PVar8;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar12 = vpmovsxwd_avx(auVar16);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar86);
  auVar105._0_4_ = auVar17._0_4_ * auVar12._0_4_;
  auVar105._4_4_ = auVar17._4_4_ * auVar12._4_4_;
  auVar105._8_4_ = auVar17._8_4_ * auVar12._8_4_;
  auVar105._12_4_ = auVar17._12_4_ * auVar12._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar74 * 0x15 + 6);
  auVar12 = vpmovsxwd_avx(auVar17);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vsubps_avx(auVar12,auVar120);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar74 * 0x17 + 6);
  auVar12 = vpmovsxwd_avx(auVar18);
  auVar134._0_4_ = auVar87._0_4_ * auVar13._0_4_;
  auVar134._4_4_ = auVar87._4_4_ * auVar13._4_4_;
  auVar134._8_4_ = auVar87._8_4_ * auVar13._8_4_;
  auVar134._12_4_ = auVar87._12_4_ * auVar13._12_4_;
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar120);
  auVar86._0_4_ = auVar87._0_4_ * auVar12._0_4_;
  auVar86._4_4_ = auVar87._4_4_ * auVar12._4_4_;
  auVar86._8_4_ = auVar87._8_4_ * auVar12._8_4_;
  auVar86._12_4_ = auVar87._12_4_ * auVar12._12_4_;
  auVar12 = vpminsd_avx(auVar143,auVar153);
  auVar13 = vpminsd_avx(auVar161,auVar105);
  auVar12 = vmaxps_avx(auVar12,auVar13);
  auVar13 = vpminsd_avx(auVar134,auVar86);
  uVar73 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar179._4_4_ = uVar73;
  auVar179._0_4_ = uVar73;
  auVar179._8_4_ = uVar73;
  auVar179._12_4_ = uVar73;
  auVar185 = ZEXT1664(auVar179);
  auVar13 = vmaxps_avx(auVar13,auVar179);
  auVar12 = vmaxps_avx(auVar12,auVar13);
  local_2a0._0_4_ = auVar12._0_4_ * 0.99999964;
  local_2a0._4_4_ = auVar12._4_4_ * 0.99999964;
  local_2a0._8_4_ = auVar12._8_4_ * 0.99999964;
  local_2a0._12_4_ = auVar12._12_4_ * 0.99999964;
  auVar12 = vpmaxsd_avx(auVar143,auVar153);
  auVar13 = vpmaxsd_avx(auVar161,auVar105);
  auVar12 = vminps_avx(auVar12,auVar13);
  auVar13 = vpmaxsd_avx(auVar134,auVar86);
  uVar73 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar120._4_4_ = uVar73;
  auVar120._0_4_ = uVar73;
  auVar120._8_4_ = uVar73;
  auVar120._12_4_ = uVar73;
  auVar13 = vminps_avx(auVar13,auVar120);
  auVar12 = vminps_avx(auVar12,auVar13);
  auVar121[4] = PVar8;
  auVar121._5_3_ = 0;
  auVar121[8] = PVar8;
  auVar121._9_3_ = 0;
  auVar121[0xc] = PVar8;
  auVar121._13_3_ = 0;
  auVar13 = vpcmpgtd_avx(auVar121,_DAT_01f4ad30);
  auVar87._0_4_ = auVar12._0_4_ * 1.0000004;
  auVar87._4_4_ = auVar12._4_4_ * 1.0000004;
  auVar87._8_4_ = auVar12._8_4_ * 1.0000004;
  auVar87._12_4_ = auVar12._12_4_ * 1.0000004;
  auVar12 = vcmpps_avx(local_2a0,auVar87,2);
  auVar12 = vandps_avx(auVar12,auVar13);
  uVar78 = vmovmskps_avx(auVar12);
  local_4e0 = mm_lookupmask_ps._16_8_;
  uStack_4d8 = mm_lookupmask_ps._24_8_;
  uStack_4d0 = mm_lookupmask_ps._16_8_;
  uStack_4c8 = mm_lookupmask_ps._24_8_;
  local_5d8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  for (; local_4e8 = (ulong)uVar78, local_4e8 != 0; uVar78 = (uint)uVar80 & uVar78) {
    local_720 = auVar185._0_32_;
    local_6c0 = auVar191._0_32_;
    lVar82 = 0;
    for (uVar77 = local_4e8; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
      lVar82 = lVar82 + 1;
    }
    uVar80 = local_4e8 - 1 & local_4e8;
    uVar78 = *(uint *)(prim + lVar82 * 4 + 6);
    uVar77 = (ulong)(uint)((int)lVar82 << 6);
    uVar9 = *(uint *)(prim + 2);
    local_728 = (ulong)uVar9;
    local_4c0 = (context->scene->geometries).items[local_728].ptr;
    pPVar1 = prim + uVar77 + uVar74 * 0x19 + 0x16;
    local_630 = *(undefined8 *)pPVar1;
    uStack_628 = *(undefined8 *)(pPVar1 + 8);
    if (uVar80 != 0) {
      uVar79 = uVar80 - 1 & uVar80;
      for (uVar22 = uVar80; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
      }
      if (uVar79 != 0) {
        for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
        }
      }
    }
    local_5f0 = *(undefined1 (*) [16])(prim + uVar77 + uVar74 * 0x19 + 0x26);
    local_600 = *(undefined1 (*) [16])(prim + uVar77 + uVar74 * 0x19 + 0x36);
    _local_500 = *(undefined1 (*) [16])(prim + uVar77 + uVar74 * 0x19 + 0x46);
    auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                            0x1c);
    iVar10 = (int)local_4c0[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar16 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar13 = vsubps_avx(*(undefined1 (*) [16])pPVar1,auVar16);
    uVar73 = auVar13._0_4_;
    auVar144._4_4_ = uVar73;
    auVar144._0_4_ = uVar73;
    auVar144._8_4_ = uVar73;
    auVar144._12_4_ = uVar73;
    auVar12 = vshufps_avx(auVar13,auVar13,0x55);
    auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
    aVar6 = pre->ray_space[k].vx.field_0;
    aVar7 = pre->ray_space[k].vy.field_0;
    fVar119 = pre->ray_space[k].vz.field_0.m128[0];
    fVar118 = pre->ray_space[k].vz.field_0.m128[1];
    fVar97 = pre->ray_space[k].vz.field_0.m128[2];
    fVar98 = pre->ray_space[k].vz.field_0.m128[3];
    auVar162._0_4_ = fVar119 * auVar13._0_4_;
    auVar162._4_4_ = fVar118 * auVar13._4_4_;
    auVar162._8_4_ = fVar97 * auVar13._8_4_;
    auVar162._12_4_ = fVar98 * auVar13._12_4_;
    auVar12 = vfmadd231ps_fma(auVar162,(undefined1  [16])aVar7,auVar12);
    auVar18 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar6,auVar144);
    auVar12 = vblendps_avx(auVar18,*(undefined1 (*) [16])pPVar1,8);
    auVar15 = vsubps_avx(local_5f0,auVar16);
    uVar73 = auVar15._0_4_;
    auVar163._4_4_ = uVar73;
    auVar163._0_4_ = uVar73;
    auVar163._8_4_ = uVar73;
    auVar163._12_4_ = uVar73;
    auVar13 = vshufps_avx(auVar15,auVar15,0x55);
    auVar15 = vshufps_avx(auVar15,auVar15,0xaa);
    auVar180._0_4_ = fVar119 * auVar15._0_4_;
    auVar180._4_4_ = fVar118 * auVar15._4_4_;
    auVar180._8_4_ = fVar97 * auVar15._8_4_;
    auVar180._12_4_ = fVar98 * auVar15._12_4_;
    auVar13 = vfmadd231ps_fma(auVar180,(undefined1  [16])aVar7,auVar13);
    auVar87 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar6,auVar163);
    auVar13 = vblendps_avx(auVar87,local_5f0,8);
    auVar17 = vsubps_avx(local_600,auVar16);
    uVar73 = auVar17._0_4_;
    auVar172._4_4_ = uVar73;
    auVar172._0_4_ = uVar73;
    auVar172._8_4_ = uVar73;
    auVar172._12_4_ = uVar73;
    auVar15 = vshufps_avx(auVar17,auVar17,0x55);
    auVar17 = vshufps_avx(auVar17,auVar17,0xaa);
    auVar190._0_4_ = fVar119 * auVar17._0_4_;
    auVar190._4_4_ = fVar118 * auVar17._4_4_;
    auVar190._8_4_ = fVar97 * auVar17._8_4_;
    auVar190._12_4_ = fVar98 * auVar17._12_4_;
    auVar15 = vfmadd231ps_fma(auVar190,(undefined1  [16])aVar7,auVar15);
    auVar86 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar6,auVar172);
    auVar15 = vblendps_avx(auVar86,local_600,8);
    auVar17 = vsubps_avx(_local_500,auVar16);
    uVar73 = auVar17._0_4_;
    auVar173._4_4_ = uVar73;
    auVar173._0_4_ = uVar73;
    auVar173._8_4_ = uVar73;
    auVar173._12_4_ = uVar73;
    auVar16 = vshufps_avx(auVar17,auVar17,0x55);
    auVar17 = vshufps_avx(auVar17,auVar17,0xaa);
    auVar192._0_4_ = fVar119 * auVar17._0_4_;
    auVar192._4_4_ = fVar118 * auVar17._4_4_;
    auVar192._8_4_ = fVar97 * auVar17._8_4_;
    auVar192._12_4_ = fVar98 * auVar17._12_4_;
    auVar16 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar7,auVar16);
    auVar120 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar6,auVar173);
    auVar16 = vblendps_avx(auVar120,_local_500,8);
    auVar12 = vandps_avx(auVar12,local_290);
    auVar13 = vandps_avx(auVar13,local_290);
    auVar17 = vmaxps_avx(auVar12,auVar13);
    auVar12 = vandps_avx(auVar15,local_290);
    auVar13 = vandps_avx(auVar16,local_290);
    auVar12 = vmaxps_avx(auVar12,auVar13);
    auVar12 = vmaxps_avx(auVar17,auVar12);
    auVar13 = vmovshdup_avx(auVar12);
    auVar13 = vmaxss_avx(auVar13,auVar12);
    auVar12 = vshufpd_avx(auVar12,auVar12,1);
    auVar12 = vmaxss_avx(auVar12,auVar13);
    local_4f0 = (long)iVar10;
    lVar82 = local_4f0 * 0x44;
    auVar13 = vmovshdup_avx(auVar18);
    uVar83 = auVar13._0_8_;
    local_4a0._8_8_ = uVar83;
    local_4a0._0_8_ = uVar83;
    local_4a0._16_8_ = uVar83;
    local_4a0._24_8_ = uVar83;
    auVar15 = vmovshdup_avx(auVar87);
    uVar83 = auVar15._0_8_;
    local_680._8_8_ = uVar83;
    local_680._0_8_ = uVar83;
    local_680._16_8_ = uVar83;
    local_680._24_8_ = uVar83;
    auVar150 = *(undefined1 (*) [32])(bezier_basis0 + lVar82 + 0x908);
    uVar189 = auVar86._0_4_;
    local_6e0._4_4_ = uVar189;
    local_6e0._0_4_ = uVar189;
    local_6e0._8_4_ = uVar189;
    local_6e0._12_4_ = uVar189;
    local_6e0._16_4_ = uVar189;
    local_6e0._20_4_ = uVar189;
    local_6e0._24_4_ = uVar189;
    local_6e0._28_4_ = uVar189;
    auVar15 = vmovshdup_avx(auVar86);
    uVar83 = auVar15._0_8_;
    local_620._8_8_ = uVar83;
    local_620._0_8_ = uVar83;
    local_620._16_8_ = uVar83;
    local_620._24_8_ = uVar83;
    fVar119 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar82 + 0xd8c);
    auVar72 = *(undefined1 (*) [28])(bezier_basis0 + lVar82 + 0xd8c);
    local_660 = auVar120._0_4_;
    auVar16 = vmovshdup_avx(auVar120);
    uVar83 = auVar16._0_8_;
    auVar147._4_4_ = local_660 * *(float *)(bezier_basis0 + lVar82 + 0xd90);
    auVar147._0_4_ = local_660 * fVar119;
    auVar147._8_4_ = local_660 * *(float *)(bezier_basis0 + lVar82 + 0xd94);
    auVar147._12_4_ = local_660 * *(float *)(bezier_basis0 + lVar82 + 0xd98);
    auVar147._16_4_ = local_660 * *(float *)(bezier_basis0 + lVar82 + 0xd9c);
    auVar147._20_4_ = local_660 * *(float *)(bezier_basis0 + lVar82 + 0xda0);
    auVar147._24_4_ = local_660 * *(float *)(bezier_basis0 + lVar82 + 0xda4);
    auVar147._28_4_ = *(undefined4 *)(bezier_basis0 + lVar82 + 0xda8);
    auVar17 = vfmadd231ps_fma(auVar147,auVar150,local_6e0);
    fVar133 = auVar16._0_4_;
    auVar160._0_4_ = fVar133 * fVar119;
    fVar141 = auVar16._4_4_;
    auVar160._4_4_ = fVar141 * *(float *)(bezier_basis0 + lVar82 + 0xd90);
    auVar160._8_4_ = fVar133 * *(float *)(bezier_basis0 + lVar82 + 0xd94);
    auVar160._12_4_ = fVar141 * *(float *)(bezier_basis0 + lVar82 + 0xd98);
    auVar160._16_4_ = fVar133 * *(float *)(bezier_basis0 + lVar82 + 0xd9c);
    auVar160._20_4_ = fVar141 * *(float *)(bezier_basis0 + lVar82 + 0xda0);
    auVar160._24_4_ = fVar133 * *(float *)(bezier_basis0 + lVar82 + 0xda4);
    auVar160._28_4_ = 0;
    auVar16 = vfmadd231ps_fma(auVar160,auVar150,local_620);
    auVar147 = *(undefined1 (*) [32])(bezier_basis0 + lVar82 + 0x484);
    uVar73 = auVar87._0_4_;
    local_700._4_4_ = uVar73;
    local_700._0_4_ = uVar73;
    local_700._8_4_ = uVar73;
    local_700._12_4_ = uVar73;
    local_700._16_4_ = uVar73;
    local_700._20_4_ = uVar73;
    local_700._24_4_ = uVar73;
    local_700._28_4_ = uVar73;
    auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar147,local_700);
    auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar147,local_680);
    auVar160 = *(undefined1 (*) [32])(bezier_basis0 + lVar82);
    local_460._0_4_ = auVar18._0_4_;
    auVar201._4_4_ = local_460._0_4_;
    auVar201._0_4_ = local_460._0_4_;
    auVar201._8_4_ = local_460._0_4_;
    auVar201._12_4_ = local_460._0_4_;
    auVar201._16_4_ = local_460._0_4_;
    auVar201._20_4_ = local_460._0_4_;
    auVar201._24_4_ = local_460._0_4_;
    auVar201._28_4_ = local_460._0_4_;
    auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar160,auVar201);
    auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar160,local_4a0);
    local_340 = *(undefined1 (*) [32])(bezier_basis1 + lVar82 + 0x908);
    fVar118 = *(float *)(bezier_basis1 + lVar82 + 0xd8c);
    fVar97 = *(float *)(bezier_basis1 + lVar82 + 0xd90);
    fVar98 = *(float *)(bezier_basis1 + lVar82 + 0xd94);
    fVar99 = *(float *)(bezier_basis1 + lVar82 + 0xd98);
    fVar100 = *(float *)(bezier_basis1 + lVar82 + 0xd9c);
    fVar101 = *(float *)(bezier_basis1 + lVar82 + 0xda0);
    fVar102 = *(float *)(bezier_basis1 + lVar82 + 0xda4);
    auVar95._4_4_ = local_660 * fVar97;
    auVar95._0_4_ = local_660 * fVar118;
    auVar95._8_4_ = local_660 * fVar98;
    auVar95._12_4_ = local_660 * fVar99;
    auVar95._16_4_ = local_660 * fVar100;
    auVar95._20_4_ = local_660 * fVar101;
    auVar95._24_4_ = local_660 * fVar102;
    auVar95._28_4_ = *(undefined4 *)(bezier_basis0 + lVar82 + 0xda8);
    auVar105 = vfmadd231ps_fma(auVar95,local_340,local_6e0);
    auVar112._4_4_ = fVar141 * fVar97;
    auVar112._0_4_ = fVar133 * fVar118;
    auVar112._8_4_ = fVar133 * fVar98;
    auVar112._12_4_ = fVar141 * fVar99;
    auVar112._16_4_ = fVar133 * fVar100;
    auVar112._20_4_ = fVar141 * fVar101;
    auVar112._24_4_ = fVar133 * fVar102;
    auVar112._28_4_ = uVar189;
    auVar85 = vfmadd231ps_fma(auVar112,local_340,local_620);
    auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar82 + 0x484);
    auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar95,local_700);
    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar95,local_680);
    auVar112 = *(undefined1 (*) [32])(bezier_basis1 + lVar82);
    auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar112,auVar201);
    auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar112,local_4a0);
    local_2e0 = ZEXT1632(auVar105);
    local_2c0 = ZEXT1632(auVar17);
    auVar19 = vsubps_avx(local_2e0,local_2c0);
    local_300 = ZEXT1632(auVar85);
    _local_320 = ZEXT1632(auVar16);
    auVar96 = vsubps_avx(local_300,_local_320);
    auVar89._0_4_ = auVar16._0_4_ * auVar19._0_4_;
    auVar89._4_4_ = auVar16._4_4_ * auVar19._4_4_;
    auVar89._8_4_ = auVar16._8_4_ * auVar19._8_4_;
    auVar89._12_4_ = auVar16._12_4_ * auVar19._12_4_;
    auVar89._16_4_ = auVar19._16_4_ * 0.0;
    auVar89._20_4_ = auVar19._20_4_ * 0.0;
    auVar89._24_4_ = auVar19._24_4_ * 0.0;
    auVar89._28_4_ = 0;
    fVar197 = auVar96._0_4_;
    auVar108._0_4_ = fVar197 * auVar17._0_4_;
    fVar205 = auVar96._4_4_;
    auVar108._4_4_ = fVar205 * auVar17._4_4_;
    fVar206 = auVar96._8_4_;
    auVar108._8_4_ = fVar206 * auVar17._8_4_;
    fVar207 = auVar96._12_4_;
    auVar108._12_4_ = fVar207 * auVar17._12_4_;
    fVar208 = auVar96._16_4_;
    auVar108._16_4_ = fVar208 * 0.0;
    fVar209 = auVar96._20_4_;
    auVar108._20_4_ = fVar209 * 0.0;
    fVar210 = auVar96._24_4_;
    auVar108._24_4_ = fVar210 * 0.0;
    auVar108._28_4_ = 0;
    auVar89 = vsubps_avx(auVar89,auVar108);
    auVar16 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
    uVar103 = auVar16._0_8_;
    local_80._8_8_ = uVar103;
    local_80._0_8_ = uVar103;
    local_80._16_8_ = uVar103;
    local_80._24_8_ = uVar103;
    auVar17 = vpermilps_avx(local_5f0,0xff);
    uVar103 = auVar17._0_8_;
    local_a0._8_8_ = uVar103;
    local_a0._0_8_ = uVar103;
    local_a0._16_8_ = uVar103;
    local_a0._24_8_ = uVar103;
    auVar17 = vpermilps_avx(local_600,0xff);
    uVar103 = auVar17._0_8_;
    local_c0._8_8_ = uVar103;
    local_c0._0_8_ = uVar103;
    local_c0._16_8_ = uVar103;
    local_c0._24_8_ = uVar103;
    auVar17 = vpermilps_avx(_local_500,0xff);
    local_e0 = auVar17._0_8_;
    local_800 = auVar72._0_4_;
    fStack_7fc = auVar72._4_4_;
    fStack_7f8 = auVar72._8_4_;
    fStack_7f4 = auVar72._12_4_;
    fStack_7f0 = auVar72._16_4_;
    fStack_7ec = auVar72._20_4_;
    fStack_7e8 = auVar72._24_4_;
    fVar119 = auVar17._0_4_;
    fVar117 = auVar17._4_4_;
    auVar14._4_4_ = fVar117 * fStack_7fc;
    auVar14._0_4_ = fVar119 * local_800;
    auVar14._8_4_ = fVar119 * fStack_7f8;
    auVar14._12_4_ = fVar117 * fStack_7f4;
    auVar14._16_4_ = fVar119 * fStack_7f0;
    auVar14._20_4_ = fVar117 * fStack_7ec;
    auVar14._24_4_ = fVar119 * fStack_7e8;
    auVar14._28_4_ = auVar13._4_4_;
    auVar13 = vfmadd231ps_fma(auVar14,local_c0,auVar150);
    auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar147,local_a0);
    auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar160,local_80);
    uStack_d8 = local_e0;
    uStack_d0 = local_e0;
    uStack_c8 = local_e0;
    auVar21._4_4_ = fVar117 * fVar97;
    auVar21._0_4_ = fVar119 * fVar118;
    auVar21._8_4_ = fVar119 * fVar98;
    auVar21._12_4_ = fVar117 * fVar99;
    auVar21._16_4_ = fVar119 * fVar100;
    auVar21._20_4_ = fVar117 * fVar101;
    auVar21._24_4_ = fVar119 * fVar102;
    auVar21._28_4_ = auVar160._28_4_;
    auVar17 = vfmadd231ps_fma(auVar21,local_340,local_c0);
    auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar95,local_a0);
    auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar112,local_80);
    auVar114._4_4_ = fVar205 * fVar205;
    auVar114._0_4_ = fVar197 * fVar197;
    auVar114._8_4_ = fVar206 * fVar206;
    auVar114._12_4_ = fVar207 * fVar207;
    auVar114._16_4_ = fVar208 * fVar208;
    auVar114._20_4_ = fVar209 * fVar209;
    auVar114._24_4_ = fVar210 * fVar210;
    auVar114._28_4_ = auVar16._4_4_;
    auVar16 = vfmadd231ps_fma(auVar114,auVar19,auVar19);
    auVar14 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar17));
    auVar130._4_4_ = auVar14._4_4_ * auVar14._4_4_ * auVar16._4_4_;
    auVar130._0_4_ = auVar14._0_4_ * auVar14._0_4_ * auVar16._0_4_;
    auVar130._8_4_ = auVar14._8_4_ * auVar14._8_4_ * auVar16._8_4_;
    auVar130._12_4_ = auVar14._12_4_ * auVar14._12_4_ * auVar16._12_4_;
    auVar130._16_4_ = auVar14._16_4_ * auVar14._16_4_ * 0.0;
    auVar130._20_4_ = auVar14._20_4_ * auVar14._20_4_ * 0.0;
    auVar130._24_4_ = auVar14._24_4_ * auVar14._24_4_ * 0.0;
    auVar130._28_4_ = auVar14._28_4_;
    auVar181._4_4_ = auVar89._4_4_ * auVar89._4_4_;
    auVar181._0_4_ = auVar89._0_4_ * auVar89._0_4_;
    auVar181._8_4_ = auVar89._8_4_ * auVar89._8_4_;
    auVar181._12_4_ = auVar89._12_4_ * auVar89._12_4_;
    auVar181._16_4_ = auVar89._16_4_ * auVar89._16_4_;
    auVar181._20_4_ = auVar89._20_4_ * auVar89._20_4_;
    auVar181._24_4_ = auVar89._24_4_ * auVar89._24_4_;
    auVar181._28_4_ = auVar89._28_4_;
    auVar14 = vcmpps_avx(auVar181,auVar130,2);
    fVar119 = auVar12._0_4_ * 4.7683716e-07;
    auVar90._0_4_ = (float)iVar10;
    register0x00001504 = auVar120._4_12_;
    auVar90._4_4_ = auVar90._0_4_;
    auVar90._8_4_ = auVar90._0_4_;
    auVar90._12_4_ = auVar90._0_4_;
    auVar90._16_4_ = auVar90._0_4_;
    auVar90._20_4_ = auVar90._0_4_;
    auVar90._24_4_ = auVar90._0_4_;
    auVar90._28_4_ = auVar90._0_4_;
    auVar89 = vcmpps_avx(_DAT_01f7b060,auVar90,1);
    auVar12 = vpermilps_avx(auVar18,0xaa);
    uVar103 = auVar12._0_8_;
    auVar135._8_8_ = uVar103;
    auVar135._0_8_ = uVar103;
    auVar135._16_8_ = uVar103;
    auVar135._24_8_ = uVar103;
    auVar12 = vpermilps_avx(auVar87,0xaa);
    uVar103 = auVar12._0_8_;
    local_240._8_8_ = uVar103;
    local_240._0_8_ = uVar103;
    local_240._16_8_ = uVar103;
    local_240._24_8_ = uVar103;
    auVar12 = vpermilps_avx(auVar86,0xaa);
    uVar103 = auVar12._0_8_;
    local_460._8_8_ = uVar103;
    local_460._0_8_ = uVar103;
    local_460._16_8_ = uVar103;
    local_460._24_8_ = uVar103;
    auVar12 = vshufps_avx(auVar120,auVar120,0xaa);
    uVar103 = auVar12._0_8_;
    register0x00001508 = uVar103;
    local_520 = uVar103;
    register0x00001510 = uVar103;
    register0x00001518 = uVar103;
    auVar195 = ZEXT3264(_local_520);
    auVar21 = auVar89 & auVar14;
    uVar5 = *(uint *)(ray + k * 4 + 0x30);
    local_560._0_16_ = ZEXT416(uVar5);
    local_480._0_16_ = ZEXT416(uVar78);
    fStack_65c = local_660;
    fStack_658 = local_660;
    fStack_654 = local_660;
    fStack_650 = local_660;
    fStack_64c = local_660;
    fStack_648 = local_660;
    fStack_644 = local_660;
    local_530._0_4_ = auVar90._0_4_;
    if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar21 >> 0x7f,0) == '\0') &&
          (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar21 >> 0xbf,0) == '\0') &&
        (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar21[0x1f]) {
      uVar77 = 0;
      auVar191 = ZEXT3264(local_6c0);
      auVar185 = ZEXT3264(local_720);
      auVar116 = ZEXT3264(local_680);
      auVar204 = ZEXT3264(local_6e0);
      auVar140 = ZEXT3264(local_620);
      auVar175 = ZEXT3264(CONCAT428(local_660,
                                    CONCAT424(local_660,
                                              CONCAT420(local_660,
                                                        CONCAT416(local_660,
                                                                  CONCAT412(local_660,
                                                                            CONCAT48(local_660,
                                                                                     CONCAT44(
                                                  local_660,local_660))))))));
      auVar169 = ZEXT3264(CONCAT428(fVar141,CONCAT424(fVar133,CONCAT420(fVar141,CONCAT416(fVar133,
                                                  CONCAT412(fVar141,CONCAT48(fVar133,uVar83)))))));
      auVar198 = ZEXT3264(local_700);
    }
    else {
      local_360 = vandps_avx(auVar14,auVar89);
      fVar117 = auVar12._0_4_;
      fVar197 = auVar12._4_4_;
      auVar166._4_4_ = fVar197 * fVar97;
      auVar166._0_4_ = fVar117 * fVar118;
      auVar166._8_4_ = fVar117 * fVar98;
      auVar166._12_4_ = fVar197 * fVar99;
      auVar166._16_4_ = fVar117 * fVar100;
      auVar166._20_4_ = fVar197 * fVar101;
      auVar166._24_4_ = fVar117 * fVar102;
      auVar166._28_4_ = local_360._28_4_;
      auVar12 = vfmadd213ps_fma(local_340,local_460,auVar166);
      auVar12 = vfmadd213ps_fma(auVar95,local_240,ZEXT1632(auVar12));
      auVar12 = vfmadd213ps_fma(auVar112,auVar135,ZEXT1632(auVar12));
      auVar91._0_4_ = fVar117 * local_800;
      auVar91._4_4_ = fVar197 * fStack_7fc;
      auVar91._8_4_ = fVar117 * fStack_7f8;
      auVar91._12_4_ = fVar197 * fStack_7f4;
      auVar91._16_4_ = fVar117 * fStack_7f0;
      auVar91._20_4_ = fVar197 * fStack_7ec;
      auVar91._24_4_ = fVar117 * fStack_7e8;
      auVar91._28_4_ = 0;
      auVar16 = vfmadd213ps_fma(auVar150,local_460,auVar91);
      auVar16 = vfmadd213ps_fma(auVar147,local_240,ZEXT1632(auVar16));
      auVar150 = *(undefined1 (*) [32])(bezier_basis0 + lVar82 + 0x1210);
      auVar147 = *(undefined1 (*) [32])(bezier_basis0 + lVar82 + 0x1694);
      auVar95 = *(undefined1 (*) [32])(bezier_basis0 + lVar82 + 0x1b18);
      fVar118 = *(float *)(bezier_basis0 + lVar82 + 0x1f9c);
      fVar97 = *(float *)(bezier_basis0 + lVar82 + 0x1fa0);
      fVar98 = *(float *)(bezier_basis0 + lVar82 + 0x1fa4);
      fVar99 = *(float *)(bezier_basis0 + lVar82 + 0x1fa8);
      fVar100 = *(float *)(bezier_basis0 + lVar82 + 0x1fac);
      fVar101 = *(float *)(bezier_basis0 + lVar82 + 0x1fb0);
      fVar102 = *(float *)(bezier_basis0 + lVar82 + 0x1fb4);
      auVar156._0_4_ = fVar118 * local_660;
      auVar156._4_4_ = fVar97 * local_660;
      auVar156._8_4_ = fVar98 * local_660;
      auVar156._12_4_ = fVar99 * local_660;
      auVar156._16_4_ = fVar100 * local_660;
      auVar156._20_4_ = fVar101 * local_660;
      auVar156._24_4_ = fVar102 * local_660;
      auVar156._28_4_ = 0;
      auVar176._0_4_ = fVar118 * fVar133;
      auVar176._4_4_ = fVar97 * fVar141;
      auVar176._8_4_ = fVar98 * fVar133;
      auVar176._12_4_ = fVar99 * fVar141;
      auVar176._16_4_ = fVar100 * fVar133;
      auVar176._20_4_ = fVar101 * fVar141;
      auVar176._24_4_ = fVar102 * fVar133;
      auVar176._28_4_ = 0;
      auVar20._4_4_ = fVar197 * fVar97;
      auVar20._0_4_ = fVar117 * fVar118;
      auVar20._8_4_ = fVar117 * fVar98;
      auVar20._12_4_ = fVar197 * fVar99;
      auVar20._16_4_ = fVar117 * fVar100;
      auVar20._20_4_ = fVar197 * fVar101;
      auVar20._24_4_ = fVar117 * fVar102;
      auVar20._28_4_ = auVar19._28_4_;
      auVar18 = vfmadd231ps_fma(auVar156,auVar95,local_6e0);
      auVar87 = vfmadd231ps_fma(auVar176,auVar95,local_620);
      auVar86 = vfmadd231ps_fma(auVar20,local_460,auVar95);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar147,local_700);
      auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar147,local_680);
      auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),local_240,auVar147);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar150,auVar201);
      auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar150,local_4a0);
      auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar135,auVar150);
      fVar118 = *(float *)(bezier_basis1 + lVar82 + 0x1f9c);
      fVar97 = *(float *)(bezier_basis1 + lVar82 + 0x1fa0);
      fVar98 = *(float *)(bezier_basis1 + lVar82 + 0x1fa4);
      fVar99 = *(float *)(bezier_basis1 + lVar82 + 0x1fa8);
      fVar100 = *(float *)(bezier_basis1 + lVar82 + 0x1fac);
      fVar101 = *(float *)(bezier_basis1 + lVar82 + 0x1fb0);
      fVar102 = *(float *)(bezier_basis1 + lVar82 + 0x1fb4);
      auVar148._4_4_ = fVar97 * local_660;
      auVar148._0_4_ = fVar118 * local_660;
      auVar148._8_4_ = fVar98 * local_660;
      auVar148._12_4_ = fVar99 * local_660;
      auVar148._16_4_ = fVar100 * local_660;
      auVar148._20_4_ = fVar101 * local_660;
      auVar148._24_4_ = fVar102 * local_660;
      auVar148._28_4_ = auVar150._28_4_;
      auVar174._4_4_ = fVar97 * fVar141;
      auVar174._0_4_ = fVar118 * fVar133;
      auVar174._8_4_ = fVar98 * fVar133;
      auVar174._12_4_ = fVar99 * fVar141;
      auVar174._16_4_ = fVar100 * fVar133;
      auVar174._20_4_ = fVar101 * fVar141;
      auVar174._24_4_ = fVar102 * fVar133;
      auVar174._28_4_ = fVar197;
      auVar23._4_4_ = fVar197 * fVar97;
      auVar23._0_4_ = fVar117 * fVar118;
      auVar23._8_4_ = fVar117 * fVar98;
      auVar23._12_4_ = fVar197 * fVar99;
      auVar23._16_4_ = fVar117 * fVar100;
      auVar23._20_4_ = fVar197 * fVar101;
      auVar23._24_4_ = fVar117 * fVar102;
      auVar23._28_4_ = auVar15._4_4_;
      auVar150 = *(undefined1 (*) [32])(bezier_basis1 + lVar82 + 0x1b18);
      auVar15 = vfmadd231ps_fma(auVar148,auVar150,local_6e0);
      auVar120 = vfmadd231ps_fma(auVar174,auVar150,local_620);
      auVar105 = vfmadd231ps_fma(auVar23,auVar150,local_460);
      auVar150 = *(undefined1 (*) [32])(bezier_basis1 + lVar82 + 0x1694);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar150,local_700);
      auVar120 = vfmadd231ps_fma(ZEXT1632(auVar120),auVar150,local_680);
      auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),local_240,auVar150);
      auVar150 = *(undefined1 (*) [32])(bezier_basis1 + lVar82 + 0x1210);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar150,auVar201);
      auVar120 = vfmadd231ps_fma(ZEXT1632(auVar120),auVar150,local_4a0);
      auVar109._8_4_ = 0x7fffffff;
      auVar109._0_8_ = 0x7fffffff7fffffff;
      auVar109._12_4_ = 0x7fffffff;
      auVar109._16_4_ = 0x7fffffff;
      auVar109._20_4_ = 0x7fffffff;
      auVar109._24_4_ = 0x7fffffff;
      auVar109._28_4_ = 0x7fffffff;
      auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar135,auVar150);
      auVar150 = vandps_avx(ZEXT1632(auVar18),auVar109);
      auVar147 = vandps_avx(ZEXT1632(auVar87),auVar109);
      auVar147 = vmaxps_avx(auVar150,auVar147);
      auVar150 = vandps_avx(ZEXT1632(auVar86),auVar109);
      auVar150 = vmaxps_avx(auVar147,auVar150);
      auVar128._4_4_ = fVar119;
      auVar128._0_4_ = fVar119;
      auVar128._8_4_ = fVar119;
      auVar128._12_4_ = fVar119;
      auVar128._16_4_ = fVar119;
      auVar128._20_4_ = fVar119;
      auVar128._24_4_ = fVar119;
      auVar128._28_4_ = fVar119;
      auVar150 = vcmpps_avx(auVar150,auVar128,1);
      auVar95 = vblendvps_avx(ZEXT1632(auVar18),auVar19,auVar150);
      auVar112 = vblendvps_avx(ZEXT1632(auVar87),auVar96,auVar150);
      auVar150 = vandps_avx(ZEXT1632(auVar15),auVar109);
      auVar147 = vandps_avx(ZEXT1632(auVar120),auVar109);
      auVar14 = vmaxps_avx(auVar150,auVar147);
      auVar150 = vandps_avx(ZEXT1632(auVar105),auVar109);
      auVar150 = vmaxps_avx(auVar14,auVar150);
      auVar89 = vcmpps_avx(auVar150,auVar128,1);
      auVar150 = vblendvps_avx(ZEXT1632(auVar15),auVar19,auVar89);
      auVar14 = vblendvps_avx(ZEXT1632(auVar120),auVar96,auVar89);
      auVar15 = vfmadd213ps_fma(auVar160,auVar135,ZEXT1632(auVar16));
      auVar16 = vfmadd213ps_fma(auVar95,auVar95,ZEXT832(0) << 0x20);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar112,auVar112);
      auVar160 = vrsqrtps_avx(ZEXT1632(auVar16));
      fVar118 = auVar160._0_4_;
      fVar97 = auVar160._4_4_;
      fVar98 = auVar160._8_4_;
      fVar99 = auVar160._12_4_;
      fVar100 = auVar160._16_4_;
      fVar101 = auVar160._20_4_;
      fVar102 = auVar160._24_4_;
      auVar19._4_4_ = fVar97 * fVar97 * fVar97 * auVar16._4_4_ * -0.5;
      auVar19._0_4_ = fVar118 * fVar118 * fVar118 * auVar16._0_4_ * -0.5;
      auVar19._8_4_ = fVar98 * fVar98 * fVar98 * auVar16._8_4_ * -0.5;
      auVar19._12_4_ = fVar99 * fVar99 * fVar99 * auVar16._12_4_ * -0.5;
      auVar19._16_4_ = fVar100 * fVar100 * fVar100 * -0.0;
      auVar19._20_4_ = fVar101 * fVar101 * fVar101 * -0.0;
      auVar19._24_4_ = fVar102 * fVar102 * fVar102 * -0.0;
      auVar19._28_4_ = auVar147._28_4_;
      auVar202._8_4_ = 0x3fc00000;
      auVar202._0_8_ = 0x3fc000003fc00000;
      auVar202._12_4_ = 0x3fc00000;
      auVar202._16_4_ = 0x3fc00000;
      auVar202._20_4_ = 0x3fc00000;
      auVar202._24_4_ = 0x3fc00000;
      auVar202._28_4_ = 0x3fc00000;
      auVar16 = vfmadd231ps_fma(auVar19,auVar202,auVar160);
      fVar118 = auVar16._0_4_;
      fVar97 = auVar16._4_4_;
      auVar96._4_4_ = fVar97 * auVar112._4_4_;
      auVar96._0_4_ = fVar118 * auVar112._0_4_;
      fVar98 = auVar16._8_4_;
      auVar96._8_4_ = fVar98 * auVar112._8_4_;
      fVar99 = auVar16._12_4_;
      auVar96._12_4_ = fVar99 * auVar112._12_4_;
      auVar96._16_4_ = auVar112._16_4_ * 0.0;
      auVar96._20_4_ = auVar112._20_4_ * 0.0;
      auVar96._24_4_ = auVar112._24_4_ * 0.0;
      auVar96._28_4_ = 0;
      auVar24._4_4_ = fVar97 * -auVar95._4_4_;
      auVar24._0_4_ = fVar118 * -auVar95._0_4_;
      auVar24._8_4_ = fVar98 * -auVar95._8_4_;
      auVar24._12_4_ = fVar99 * -auVar95._12_4_;
      auVar24._16_4_ = -auVar95._16_4_ * 0.0;
      auVar24._20_4_ = -auVar95._20_4_ * 0.0;
      auVar24._24_4_ = -auVar95._24_4_ * 0.0;
      auVar24._28_4_ = auVar160._28_4_;
      auVar16 = vfmadd213ps_fma(auVar150,auVar150,ZEXT832(0) << 0x20);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar14,auVar14);
      auVar147 = vrsqrtps_avx(ZEXT1632(auVar16));
      auVar25._28_4_ = auVar89._28_4_;
      auVar25._0_28_ =
           ZEXT1628(CONCAT412(fVar99 * 0.0,
                              CONCAT48(fVar98 * 0.0,CONCAT44(fVar97 * 0.0,fVar118 * 0.0))));
      fVar118 = auVar147._0_4_;
      fVar97 = auVar147._4_4_;
      fVar98 = auVar147._8_4_;
      fVar99 = auVar147._12_4_;
      fVar100 = auVar147._16_4_;
      fVar101 = auVar147._20_4_;
      fVar102 = auVar147._24_4_;
      auVar26._4_4_ = fVar97 * fVar97 * fVar97 * auVar16._4_4_ * -0.5;
      auVar26._0_4_ = fVar118 * fVar118 * fVar118 * auVar16._0_4_ * -0.5;
      auVar26._8_4_ = fVar98 * fVar98 * fVar98 * auVar16._8_4_ * -0.5;
      auVar26._12_4_ = fVar99 * fVar99 * fVar99 * auVar16._12_4_ * -0.5;
      auVar26._16_4_ = fVar100 * fVar100 * fVar100 * -0.0;
      auVar26._20_4_ = fVar101 * fVar101 * fVar101 * -0.0;
      auVar26._24_4_ = fVar102 * fVar102 * fVar102 * -0.0;
      auVar26._28_4_ = 0;
      auVar16 = vfmadd231ps_fma(auVar26,auVar202,auVar147);
      fVar118 = auVar16._0_4_;
      auVar187._0_4_ = auVar14._0_4_ * fVar118;
      fVar97 = auVar16._4_4_;
      auVar187._4_4_ = auVar14._4_4_ * fVar97;
      fVar98 = auVar16._8_4_;
      auVar187._8_4_ = auVar14._8_4_ * fVar98;
      fVar99 = auVar16._12_4_;
      auVar187._12_4_ = auVar14._12_4_ * fVar99;
      auVar187._16_4_ = auVar14._16_4_ * 0.0;
      auVar187._20_4_ = auVar14._20_4_ * 0.0;
      auVar187._24_4_ = auVar14._24_4_ * 0.0;
      auVar187._28_4_ = 0;
      auVar27._4_4_ = -auVar150._4_4_ * fVar97;
      auVar27._0_4_ = -auVar150._0_4_ * fVar118;
      auVar27._8_4_ = -auVar150._8_4_ * fVar98;
      auVar27._12_4_ = -auVar150._12_4_ * fVar99;
      auVar27._16_4_ = -auVar150._16_4_ * 0.0;
      auVar27._20_4_ = -auVar150._20_4_ * 0.0;
      auVar27._24_4_ = -auVar150._24_4_ * 0.0;
      auVar27._28_4_ = auVar14._28_4_;
      auVar150._28_4_ = auVar147._28_4_;
      auVar150._0_28_ =
           ZEXT1628(CONCAT412(fVar99 * 0.0,
                              CONCAT48(fVar98 * 0.0,CONCAT44(fVar97 * 0.0,fVar118 * 0.0))));
      auVar16 = vfmadd213ps_fma(auVar96,ZEXT1632(auVar13),local_2c0);
      auVar147 = ZEXT1632(auVar13);
      auVar18 = vfmadd213ps_fma(auVar24,auVar147,_local_320);
      auVar87 = vfmadd213ps_fma(auVar25,auVar147,ZEXT1632(auVar15));
      auVar120 = vfnmadd213ps_fma(auVar96,auVar147,local_2c0);
      auVar86 = vfmadd213ps_fma(auVar187,ZEXT1632(auVar17),local_2e0);
      auVar105 = vfnmadd213ps_fma(auVar24,auVar147,_local_320);
      auVar174 = ZEXT1632(auVar17);
      auVar17 = vfmadd213ps_fma(auVar27,auVar174,local_300);
      auVar148 = ZEXT1632(auVar13);
      auVar134 = vfnmadd231ps_fma(ZEXT1632(auVar15),auVar148,auVar25);
      auVar13 = vfmadd213ps_fma(auVar150,auVar174,ZEXT1632(auVar12));
      auVar85 = vfnmadd213ps_fma(auVar187,auVar174,local_2e0);
      auVar121 = vfnmadd213ps_fma(auVar27,auVar174,local_300);
      auVar143 = vfnmadd231ps_fma(ZEXT1632(auVar12),auVar174,auVar150);
      auVar150 = vsubps_avx(ZEXT1632(auVar17),ZEXT1632(auVar105));
      auVar147 = vsubps_avx(ZEXT1632(auVar13),ZEXT1632(auVar134));
      auVar28._4_4_ = auVar134._4_4_ * auVar150._4_4_;
      auVar28._0_4_ = auVar134._0_4_ * auVar150._0_4_;
      auVar28._8_4_ = auVar134._8_4_ * auVar150._8_4_;
      auVar28._12_4_ = auVar134._12_4_ * auVar150._12_4_;
      auVar28._16_4_ = auVar150._16_4_ * 0.0;
      auVar28._20_4_ = auVar150._20_4_ * 0.0;
      auVar28._24_4_ = auVar150._24_4_ * 0.0;
      auVar28._28_4_ = 0;
      auVar15 = vfmsub231ps_fma(auVar28,ZEXT1632(auVar105),auVar147);
      auVar29._4_4_ = auVar147._4_4_ * auVar120._4_4_;
      auVar29._0_4_ = auVar147._0_4_ * auVar120._0_4_;
      auVar29._8_4_ = auVar147._8_4_ * auVar120._8_4_;
      auVar29._12_4_ = auVar147._12_4_ * auVar120._12_4_;
      auVar29._16_4_ = auVar147._16_4_ * 0.0;
      auVar29._20_4_ = auVar147._20_4_ * 0.0;
      auVar29._24_4_ = auVar147._24_4_ * 0.0;
      auVar29._28_4_ = auVar147._28_4_;
      auVar147 = vsubps_avx(ZEXT1632(auVar86),ZEXT1632(auVar120));
      auVar12 = vfmsub231ps_fma(auVar29,ZEXT1632(auVar134),auVar147);
      auVar30._4_4_ = auVar105._4_4_ * auVar147._4_4_;
      auVar30._0_4_ = auVar105._0_4_ * auVar147._0_4_;
      auVar30._8_4_ = auVar105._8_4_ * auVar147._8_4_;
      auVar30._12_4_ = auVar105._12_4_ * auVar147._12_4_;
      auVar30._16_4_ = auVar147._16_4_ * 0.0;
      auVar30._20_4_ = auVar147._20_4_ * 0.0;
      auVar30._24_4_ = auVar147._24_4_ * 0.0;
      auVar30._28_4_ = auVar147._28_4_;
      auVar89 = ZEXT1632(auVar120);
      auVar120 = vfmsub231ps_fma(auVar30,auVar89,auVar150);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar120),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
      auVar21 = vcmpps_avx(ZEXT1632(auVar12),ZEXT832(0) << 0x20,2);
      auVar150 = vblendvps_avx(ZEXT1632(auVar85),ZEXT1632(auVar16),auVar21);
      auVar147 = vblendvps_avx(ZEXT1632(auVar121),ZEXT1632(auVar18),auVar21);
      auVar160 = vblendvps_avx(ZEXT1632(auVar143),ZEXT1632(auVar87),auVar21);
      auVar95 = vblendvps_avx(auVar89,ZEXT1632(auVar86),auVar21);
      auVar112 = vblendvps_avx(ZEXT1632(auVar105),ZEXT1632(auVar17),auVar21);
      auVar14 = vblendvps_avx(ZEXT1632(auVar134),ZEXT1632(auVar13),auVar21);
      auVar89 = vblendvps_avx(ZEXT1632(auVar86),auVar89,auVar21);
      auVar19 = vblendvps_avx(ZEXT1632(auVar17),ZEXT1632(auVar105),auVar21);
      auVar12 = vpackssdw_avx(local_360._0_16_,local_360._16_16_);
      auVar96 = vblendvps_avx(ZEXT1632(auVar13),ZEXT1632(auVar134),auVar21);
      auVar114 = vsubps_avx(auVar89,auVar150);
      auVar130 = vsubps_avx(auVar19,auVar147);
      auVar181 = vsubps_avx(auVar96,auVar160);
      auVar108 = vsubps_avx(auVar150,auVar95);
      auVar166 = vsubps_avx(auVar147,auVar112);
      auVar20 = vsubps_avx(auVar160,auVar14);
      auVar31._4_4_ = auVar181._4_4_ * auVar150._4_4_;
      auVar31._0_4_ = auVar181._0_4_ * auVar150._0_4_;
      auVar31._8_4_ = auVar181._8_4_ * auVar150._8_4_;
      auVar31._12_4_ = auVar181._12_4_ * auVar150._12_4_;
      auVar31._16_4_ = auVar181._16_4_ * auVar150._16_4_;
      auVar31._20_4_ = auVar181._20_4_ * auVar150._20_4_;
      auVar31._24_4_ = auVar181._24_4_ * auVar150._24_4_;
      auVar31._28_4_ = auVar96._28_4_;
      auVar13 = vfmsub231ps_fma(auVar31,auVar160,auVar114);
      auVar32._4_4_ = auVar114._4_4_ * auVar147._4_4_;
      auVar32._0_4_ = auVar114._0_4_ * auVar147._0_4_;
      auVar32._8_4_ = auVar114._8_4_ * auVar147._8_4_;
      auVar32._12_4_ = auVar114._12_4_ * auVar147._12_4_;
      auVar32._16_4_ = auVar114._16_4_ * auVar147._16_4_;
      auVar32._20_4_ = auVar114._20_4_ * auVar147._20_4_;
      auVar32._24_4_ = auVar114._24_4_ * auVar147._24_4_;
      auVar32._28_4_ = auVar89._28_4_;
      auVar15 = vfmsub231ps_fma(auVar32,auVar150,auVar130);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
      auVar92._0_4_ = auVar130._0_4_ * auVar160._0_4_;
      auVar92._4_4_ = auVar130._4_4_ * auVar160._4_4_;
      auVar92._8_4_ = auVar130._8_4_ * auVar160._8_4_;
      auVar92._12_4_ = auVar130._12_4_ * auVar160._12_4_;
      auVar92._16_4_ = auVar130._16_4_ * auVar160._16_4_;
      auVar92._20_4_ = auVar130._20_4_ * auVar160._20_4_;
      auVar92._24_4_ = auVar130._24_4_ * auVar160._24_4_;
      auVar92._28_4_ = 0;
      auVar15 = vfmsub231ps_fma(auVar92,auVar147,auVar181);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
      auVar93._0_4_ = auVar20._0_4_ * auVar95._0_4_;
      auVar93._4_4_ = auVar20._4_4_ * auVar95._4_4_;
      auVar93._8_4_ = auVar20._8_4_ * auVar95._8_4_;
      auVar93._12_4_ = auVar20._12_4_ * auVar95._12_4_;
      auVar93._16_4_ = auVar20._16_4_ * auVar95._16_4_;
      auVar93._20_4_ = auVar20._20_4_ * auVar95._20_4_;
      auVar93._24_4_ = auVar20._24_4_ * auVar95._24_4_;
      auVar93._28_4_ = 0;
      auVar13 = vfmsub231ps_fma(auVar93,auVar108,auVar14);
      auVar33._4_4_ = auVar166._4_4_ * auVar14._4_4_;
      auVar33._0_4_ = auVar166._0_4_ * auVar14._0_4_;
      auVar33._8_4_ = auVar166._8_4_ * auVar14._8_4_;
      auVar33._12_4_ = auVar166._12_4_ * auVar14._12_4_;
      auVar33._16_4_ = auVar166._16_4_ * auVar14._16_4_;
      auVar33._20_4_ = auVar166._20_4_ * auVar14._20_4_;
      auVar33._24_4_ = auVar166._24_4_ * auVar14._24_4_;
      auVar33._28_4_ = auVar14._28_4_;
      auVar16 = vfmsub231ps_fma(auVar33,auVar112,auVar20);
      auVar34._4_4_ = auVar108._4_4_ * auVar112._4_4_;
      auVar34._0_4_ = auVar108._0_4_ * auVar112._0_4_;
      auVar34._8_4_ = auVar108._8_4_ * auVar112._8_4_;
      auVar34._12_4_ = auVar108._12_4_ * auVar112._12_4_;
      auVar34._16_4_ = auVar108._16_4_ * auVar112._16_4_;
      auVar34._20_4_ = auVar108._20_4_ * auVar112._20_4_;
      auVar34._24_4_ = auVar108._24_4_ * auVar112._24_4_;
      auVar34._28_4_ = auVar19._28_4_;
      auVar17 = vfmsub231ps_fma(auVar34,auVar166,auVar95);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
      auVar95 = vmaxps_avx(ZEXT1632(auVar15),ZEXT1632(auVar16));
      auVar95 = vcmpps_avx(auVar95,ZEXT832(0) << 0x20,2);
      auVar13 = vpackssdw_avx(auVar95._0_16_,auVar95._16_16_);
      auVar12 = vpand_avx(auVar13,auVar12);
      auVar95 = vpmovsxwd_avx2(auVar12);
      if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar95 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar95 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar95 >> 0x7f,0) == '\0') &&
            (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar95 >> 0xbf,0) == '\0') &&
          (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar95[0x1f])
      {
LAB_010ff3bc:
        auVar175 = ZEXT3264(CONCAT824(uStack_4c8,
                                      CONCAT816(uStack_4d0,CONCAT88(uStack_4d8,local_4e0))));
      }
      else {
        auVar35._4_4_ = auVar130._4_4_ * auVar20._4_4_;
        auVar35._0_4_ = auVar130._0_4_ * auVar20._0_4_;
        auVar35._8_4_ = auVar130._8_4_ * auVar20._8_4_;
        auVar35._12_4_ = auVar130._12_4_ * auVar20._12_4_;
        auVar35._16_4_ = auVar130._16_4_ * auVar20._16_4_;
        auVar35._20_4_ = auVar130._20_4_ * auVar20._20_4_;
        auVar35._24_4_ = auVar130._24_4_ * auVar20._24_4_;
        auVar35._28_4_ = auVar95._28_4_;
        auVar87 = vfmsub231ps_fma(auVar35,auVar166,auVar181);
        auVar110._0_4_ = auVar181._0_4_ * auVar108._0_4_;
        auVar110._4_4_ = auVar181._4_4_ * auVar108._4_4_;
        auVar110._8_4_ = auVar181._8_4_ * auVar108._8_4_;
        auVar110._12_4_ = auVar181._12_4_ * auVar108._12_4_;
        auVar110._16_4_ = auVar181._16_4_ * auVar108._16_4_;
        auVar110._20_4_ = auVar181._20_4_ * auVar108._20_4_;
        auVar110._24_4_ = auVar181._24_4_ * auVar108._24_4_;
        auVar110._28_4_ = 0;
        auVar18 = vfmsub231ps_fma(auVar110,auVar114,auVar20);
        auVar36._4_4_ = auVar114._4_4_ * auVar166._4_4_;
        auVar36._0_4_ = auVar114._0_4_ * auVar166._0_4_;
        auVar36._8_4_ = auVar114._8_4_ * auVar166._8_4_;
        auVar36._12_4_ = auVar114._12_4_ * auVar166._12_4_;
        auVar36._16_4_ = auVar114._16_4_ * auVar166._16_4_;
        auVar36._20_4_ = auVar114._20_4_ * auVar166._20_4_;
        auVar36._24_4_ = auVar114._24_4_ * auVar166._24_4_;
        auVar36._28_4_ = auVar112._28_4_;
        auVar86 = vfmsub231ps_fma(auVar36,auVar108,auVar130);
        auVar13 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar18),ZEXT1632(auVar86));
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT1632(auVar87),_DAT_01f7b000);
        auVar95 = vrcpps_avx(ZEXT1632(auVar17));
        auVar188._8_4_ = 0x3f800000;
        auVar188._0_8_ = 0x3f8000003f800000;
        auVar188._12_4_ = 0x3f800000;
        auVar188._16_4_ = 0x3f800000;
        auVar188._20_4_ = 0x3f800000;
        auVar188._24_4_ = 0x3f800000;
        auVar188._28_4_ = 0x3f800000;
        auVar13 = vfnmadd213ps_fma(auVar95,ZEXT1632(auVar17),auVar188);
        auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar95,auVar95);
        auVar164._0_4_ = auVar86._0_4_ * auVar160._0_4_;
        auVar164._4_4_ = auVar86._4_4_ * auVar160._4_4_;
        auVar164._8_4_ = auVar86._8_4_ * auVar160._8_4_;
        auVar164._12_4_ = auVar86._12_4_ * auVar160._12_4_;
        auVar164._16_4_ = auVar160._16_4_ * 0.0;
        auVar164._20_4_ = auVar160._20_4_ * 0.0;
        auVar164._24_4_ = auVar160._24_4_ * 0.0;
        auVar164._28_4_ = 0;
        auVar18 = vfmadd231ps_fma(auVar164,auVar147,ZEXT1632(auVar18));
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT1632(auVar87),auVar150);
        fVar118 = auVar13._0_4_;
        fVar97 = auVar13._4_4_;
        fVar98 = auVar13._8_4_;
        fVar99 = auVar13._12_4_;
        auVar160 = ZEXT1632(CONCAT412(fVar99 * auVar18._12_4_,
                                      CONCAT48(fVar98 * auVar18._8_4_,
                                               CONCAT44(fVar97 * auVar18._4_4_,
                                                        fVar118 * auVar18._0_4_))));
        auVar94._4_4_ = uVar5;
        auVar94._0_4_ = uVar5;
        auVar94._8_4_ = uVar5;
        auVar94._12_4_ = uVar5;
        auVar94._16_4_ = uVar5;
        auVar94._20_4_ = uVar5;
        auVar94._24_4_ = uVar5;
        auVar94._28_4_ = uVar5;
        uVar73 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar111._4_4_ = uVar73;
        auVar111._0_4_ = uVar73;
        auVar111._8_4_ = uVar73;
        auVar111._12_4_ = uVar73;
        auVar111._16_4_ = uVar73;
        auVar111._20_4_ = uVar73;
        auVar111._24_4_ = uVar73;
        auVar111._28_4_ = uVar73;
        auVar150 = vcmpps_avx(auVar94,auVar160,2);
        auVar147 = vcmpps_avx(auVar160,auVar111,2);
        auVar150 = vandps_avx(auVar147,auVar150);
        auVar13 = vpackssdw_avx(auVar150._0_16_,auVar150._16_16_);
        auVar12 = vpand_avx(auVar12,auVar13);
        auVar150 = vpmovsxwd_avx2(auVar12);
        if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar150 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar150 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar150 >> 0x7f,0) == '\0') &&
              (auVar150 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar150 >> 0xbf,0) == '\0') &&
            (auVar150 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar150[0x1f]) goto LAB_010ff3bc;
        auVar150 = vcmpps_avx(ZEXT1632(auVar17),ZEXT832(0) << 0x20,4);
        auVar13 = vpackssdw_avx(auVar150._0_16_,auVar150._16_16_);
        auVar12 = vpand_avx(auVar12,auVar13);
        auVar150 = vpmovsxwd_avx2(auVar12);
        auVar175 = ZEXT3264(CONCAT824(uStack_4c8,
                                      CONCAT816(uStack_4d0,CONCAT88(uStack_4d8,local_4e0))));
        if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar150 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar150 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar150 >> 0x7f,0) != '\0') ||
              (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar150 >> 0xbf,0) != '\0') ||
            (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar150[0x1f] < '\0') {
          auVar95 = ZEXT1632(CONCAT412(fVar99 * auVar15._12_4_,
                                       CONCAT48(fVar98 * auVar15._8_4_,
                                                CONCAT44(fVar97 * auVar15._4_4_,
                                                         fVar118 * auVar15._0_4_))));
          auVar112 = ZEXT1632(CONCAT412(fVar99 * auVar16._12_4_,
                                        CONCAT48(fVar98 * auVar16._8_4_,
                                                 CONCAT44(fVar97 * auVar16._4_4_,
                                                          fVar118 * auVar16._0_4_))));
          auVar149._8_4_ = 0x3f800000;
          auVar149._0_8_ = 0x3f8000003f800000;
          auVar149._12_4_ = 0x3f800000;
          auVar149._16_4_ = 0x3f800000;
          auVar149._20_4_ = 0x3f800000;
          auVar149._24_4_ = 0x3f800000;
          auVar149._28_4_ = 0x3f800000;
          auVar147 = vsubps_avx(auVar149,auVar95);
          _local_260 = vblendvps_avx(auVar147,auVar95,auVar21);
          auVar147 = vsubps_avx(auVar149,auVar112);
          local_380 = vblendvps_avx(auVar147,auVar112,auVar21);
          auVar175 = ZEXT3264(auVar150);
          local_280 = auVar160;
        }
      }
      auVar204 = ZEXT3264(local_6e0);
      auVar198 = ZEXT3264(local_700);
      auVar195 = ZEXT3264(_local_520);
      auVar191 = ZEXT3264(local_6c0);
      auVar116 = ZEXT3264(auVar135);
      auVar185 = ZEXT3264(local_720);
      auVar150 = auVar175._0_32_;
      if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar150 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar150 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar150 >> 0x7f,0) == '\0') &&
            (auVar175 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar150 >> 0xbf,0) == '\0') &&
          (auVar175 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar175[0x1f]) {
        auVar175 = ZEXT3264(CONCAT428(local_660,
                                      CONCAT424(local_660,
                                                CONCAT420(local_660,
                                                          CONCAT416(local_660,
                                                                    CONCAT412(local_660,
                                                                              CONCAT48(local_660,
                                                                                       CONCAT44(
                                                  local_660,local_660))))))));
      }
      else {
        auVar147 = vsubps_avx(auVar174,auVar148);
        auVar12 = vfmadd213ps_fma(auVar147,_local_260,auVar148);
        fVar118 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
        auVar37._4_4_ = (auVar12._4_4_ + auVar12._4_4_) * fVar118;
        auVar37._0_4_ = (auVar12._0_4_ + auVar12._0_4_) * fVar118;
        auVar37._8_4_ = (auVar12._8_4_ + auVar12._8_4_) * fVar118;
        auVar37._12_4_ = (auVar12._12_4_ + auVar12._12_4_) * fVar118;
        auVar37._16_4_ = fVar118 * 0.0;
        auVar37._20_4_ = fVar118 * 0.0;
        auVar37._24_4_ = fVar118 * 0.0;
        auVar37._28_4_ = 0;
        auVar147 = vcmpps_avx(local_280,auVar37,6);
        auVar160 = auVar150 & auVar147;
        auVar175 = ZEXT3264(CONCAT428(local_660,
                                      CONCAT424(local_660,
                                                CONCAT420(local_660,
                                                          CONCAT416(local_660,
                                                                    CONCAT412(local_660,
                                                                              CONCAT48(local_660,
                                                                                       CONCAT44(
                                                  local_660,local_660))))))));
        if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar160 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar160 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar160 >> 0x7f,0) != '\0') ||
              (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar160 >> 0xbf,0) != '\0') ||
            (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar160[0x1f] < '\0') {
          auVar113._8_4_ = 0xbf800000;
          auVar113._0_8_ = 0xbf800000bf800000;
          auVar113._12_4_ = 0xbf800000;
          auVar113._16_4_ = 0xbf800000;
          auVar113._20_4_ = 0xbf800000;
          auVar113._24_4_ = 0xbf800000;
          auVar113._28_4_ = 0xbf800000;
          auVar129._8_4_ = 0x40000000;
          auVar129._0_8_ = 0x4000000040000000;
          auVar129._12_4_ = 0x40000000;
          auVar129._16_4_ = 0x40000000;
          auVar129._20_4_ = 0x40000000;
          auVar129._24_4_ = 0x40000000;
          auVar129._28_4_ = 0x40000000;
          auVar12 = vfmadd213ps_fma(local_380,auVar129,auVar113);
          local_220 = _local_260;
          local_200 = ZEXT1632(auVar12);
          local_1e0 = local_280;
          local_1c0 = 0;
          local_1a0 = local_5f0._0_8_;
          uStack_198 = local_5f0._8_8_;
          local_190 = local_600._0_8_;
          uStack_188 = local_600._8_8_;
          local_380 = local_200;
          if ((local_4c0->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            uVar77 = 0;
            auVar140 = ZEXT3264(local_620);
            auVar169 = ZEXT3264(CONCAT428(fVar141,CONCAT424(fVar133,CONCAT420(fVar141,CONCAT416(
                                                  fVar133,CONCAT412(fVar141,CONCAT48(fVar133,uVar83)
                                                                   ))))));
          }
          else {
            auVar140 = ZEXT3264(local_620);
            auVar169 = ZEXT3264(CONCAT428(fVar141,CONCAT424(fVar133,CONCAT420(fVar141,CONCAT416(
                                                  fVar133,CONCAT412(fVar141,CONCAT48(fVar133,uVar83)
                                                                   ))))));
            pGVar75 = (Geometry *)context->args;
            if ((((Geometry *)context->args)->device != (Device *)0x0) ||
               (uVar77 = CONCAT71((int7)((ulong)local_4c0 >> 8),1), pGVar75 = local_4c0,
               local_4c0->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar150 = vandps_avx(auVar147,auVar150);
              fVar118 = 1.0 / auVar90._0_4_;
              local_140[0] = fVar118 * ((float)local_260._0_4_ + 0.0);
              local_140[1] = fVar118 * ((float)local_260._4_4_ + 1.0);
              local_140[2] = fVar118 * (fStack_258 + 2.0);
              local_140[3] = fVar118 * (fStack_254 + 3.0);
              fStack_130 = fVar118 * (fStack_250 + 4.0);
              fStack_12c = fVar118 * (fStack_24c + 5.0);
              fStack_128 = fVar118 * (fStack_248 + 6.0);
              fStack_124 = fStack_244 + 7.0;
              local_380._0_8_ = auVar12._0_8_;
              local_380._8_8_ = auVar12._8_8_;
              local_120 = local_380._0_8_;
              uStack_118 = local_380._8_8_;
              uStack_110 = 0;
              uStack_108 = 0;
              local_100 = local_280;
              uVar73 = vmovmskps_avx(auVar150);
              uVar77 = 0;
              uVar79 = CONCAT44((int)((ulong)pGVar75 >> 0x20),uVar73);
              for (uVar22 = uVar79; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                uVar77 = uVar77 + 1;
              }
              local_6a0._0_8_ = CONCAT44(uVar9,uVar9);
              local_6a0._0_16_ = CONCAT412(uVar9,CONCAT48(uVar9,local_6a0._0_8_));
              local_6a0 = ZEXT1632(local_6a0._0_16_);
              local_580 = (undefined1  [8])CONCAT44(uVar78,uVar78);
              _local_580 = ZEXT1632(CONCAT412(uVar78,CONCAT48(uVar78,local_580)));
              local_5a0 = auVar135;
              local_1bc = iVar10;
              local_1b0 = local_630;
              uStack_1a8 = uStack_628;
              while (auVar135 = auVar116._0_32_, uVar79 != 0) {
                uVar73 = *(undefined4 *)(ray + k * 4 + 0x80);
                local_400 = local_140[uVar77];
                local_3f0 = *(undefined4 *)((long)&local_120 + uVar77 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_100 + uVar77 * 4);
                fVar98 = 1.0 - local_400;
                auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar98 * fVar98)),
                                          ZEXT416((uint)(local_400 * fVar98)),ZEXT416(0xc0000000));
                auVar12 = vfmsub132ss_fma(ZEXT416((uint)(local_400 * fVar98)),
                                          ZEXT416((uint)(local_400 * local_400)),ZEXT416(0x40000000)
                                         );
                fVar118 = auVar12._0_4_ * 3.0;
                fVar97 = local_400 * local_400 * 3.0;
                auVar154._0_4_ = fVar97 * (float)local_500._0_4_;
                auVar154._4_4_ = fVar97 * (float)local_500._4_4_;
                auVar154._8_4_ = fVar97 * fStack_4f8;
                auVar154._12_4_ = fVar97 * fStack_4f4;
                auVar122._4_4_ = fVar118;
                auVar122._0_4_ = fVar118;
                auVar122._8_4_ = fVar118;
                auVar122._12_4_ = fVar118;
                auVar12 = vfmadd132ps_fma(auVar122,auVar154,local_600);
                fVar118 = auVar13._0_4_ * 3.0;
                auVar145._4_4_ = fVar118;
                auVar145._0_4_ = fVar118;
                auVar145._8_4_ = fVar118;
                auVar145._12_4_ = fVar118;
                auVar12 = vfmadd132ps_fma(auVar145,auVar12,local_5f0);
                fVar118 = fVar98 * fVar98 * -3.0;
                local_5d0.context = context->user;
                auVar123._4_4_ = fVar118;
                auVar123._0_4_ = fVar118;
                auVar123._8_4_ = fVar118;
                auVar123._12_4_ = fVar118;
                auVar70._8_8_ = uStack_628;
                auVar70._0_8_ = local_630;
                auVar12 = vfmadd132ps_fma(auVar123,auVar12,auVar70);
                local_430 = auVar12._0_4_;
                local_420 = vshufps_avx(auVar12,auVar12,0x55);
                local_410 = vshufps_avx(auVar12,auVar12,0xaa);
                local_3e0 = local_580;
                uStack_3d8 = uStack_578;
                local_3d0 = local_6a0._0_16_;
                vpcmpeqd_avx2(ZEXT1632(local_6a0._0_16_),ZEXT1632(local_6a0._0_16_));
                uStack_3bc = (local_5d0.context)->instID[0];
                local_3c0 = uStack_3bc;
                uStack_3b8 = uStack_3bc;
                uStack_3b4 = uStack_3bc;
                uStack_3b0 = (local_5d0.context)->instPrimID[0];
                uStack_3ac = uStack_3b0;
                uStack_3a8 = uStack_3b0;
                uStack_3a4 = uStack_3b0;
                local_740 = *local_5d8;
                local_5d0.valid = (int *)local_740;
                local_5d0.geometryUserPtr = local_4c0->userPtr;
                local_5d0.hit = (RTCHitN *)&local_430;
                local_5d0.N = 4;
                local_5d0.ray = (RTCRayN *)ray;
                uStack_42c = local_430;
                uStack_428 = local_430;
                uStack_424 = local_430;
                fStack_3fc = local_400;
                fStack_3f8 = local_400;
                fStack_3f4 = local_400;
                uStack_3ec = local_3f0;
                uStack_3e8 = local_3f0;
                uStack_3e4 = local_3f0;
                if (local_4c0->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*local_4c0->occlusionFilterN)(&local_5d0);
                  auVar195 = ZEXT3264(_local_520);
                  auVar116 = ZEXT3264(local_5a0);
                  auVar198 = ZEXT3264(local_700);
                  auVar175 = ZEXT3264(CONCAT428(fStack_644,
                                                CONCAT424(fStack_648,
                                                          CONCAT420(fStack_64c,
                                                                    CONCAT416(fStack_650,
                                                                              CONCAT412(fStack_654,
                                                                                        CONCAT48(
                                                  fStack_658,CONCAT44(fStack_65c,local_660))))))));
                  auVar204 = ZEXT3264(local_6e0);
                  auVar185 = ZEXT3264(local_720);
                  auVar191 = ZEXT3264(local_6c0);
                }
                if (local_740 == (undefined1  [16])0x0) {
                  auVar12 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar12 = auVar12 ^ _DAT_01f46b70;
                  auVar140 = ZEXT3264(local_620);
                  auVar169 = ZEXT3264(CONCAT428(fVar141,CONCAT424(fVar133,CONCAT420(fVar141,
                                                  CONCAT416(fVar133,CONCAT412(fVar141,CONCAT48(
                                                  fVar133,uVar83)))))));
                }
                else {
                  p_Var11 = context->args->filter;
                  if (p_Var11 == (RTCFilterFunctionN)0x0) {
                    auVar140 = ZEXT3264(local_620);
                    auVar169 = ZEXT3264(CONCAT428(fVar141,CONCAT424(fVar133,CONCAT420(fVar141,
                                                  CONCAT416(fVar133,CONCAT412(fVar141,CONCAT48(
                                                  fVar133,uVar83)))))));
                  }
                  else {
                    auVar140 = ZEXT3264(local_620);
                    auVar169 = ZEXT3264(CONCAT428(fVar141,CONCAT424(fVar133,CONCAT420(fVar141,
                                                  CONCAT416(fVar133,CONCAT412(fVar141,CONCAT48(
                                                  fVar133,uVar83)))))));
                    if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                       (((local_4c0->field_8).field_0x2 & 0x40) != 0)) {
                      (*p_Var11)(&local_5d0);
                      auVar195 = ZEXT3264(_local_520);
                      auVar116 = ZEXT3264(local_5a0);
                      auVar198 = ZEXT3264(local_700);
                      auVar169 = ZEXT3264(CONCAT428(fVar141,CONCAT424(fVar133,CONCAT420(fVar141,
                                                  CONCAT416(fVar133,CONCAT412(fVar141,CONCAT48(
                                                  fVar133,uVar83)))))));
                      auVar175 = ZEXT3264(CONCAT428(fStack_644,
                                                    CONCAT424(fStack_648,
                                                              CONCAT420(fStack_64c,
                                                                        CONCAT416(fStack_650,
                                                                                  CONCAT412(
                                                  fStack_654,
                                                  CONCAT48(fStack_658,CONCAT44(fStack_65c,local_660)
                                                          )))))));
                      auVar140 = ZEXT3264(local_620);
                      auVar204 = ZEXT3264(local_6e0);
                      auVar185 = ZEXT3264(local_720);
                      auVar191 = ZEXT3264(local_6c0);
                    }
                  }
                  auVar13 = vpcmpeqd_avx(local_740,_DAT_01f45a50);
                  auVar12 = auVar13 ^ _DAT_01f46b70;
                  auVar124._8_4_ = 0xff800000;
                  auVar124._0_8_ = 0xff800000ff800000;
                  auVar124._12_4_ = 0xff800000;
                  auVar13 = vblendvps_avx(auVar124,*(undefined1 (*) [16])(local_5d0.ray + 0x80),
                                          auVar13);
                  *(undefined1 (*) [16])(local_5d0.ray + 0x80) = auVar13;
                }
                auVar135 = auVar116._0_32_;
                auVar106._8_8_ = 0x100000001;
                auVar106._0_8_ = 0x100000001;
                if ((auVar106 & auVar12) != (undefined1  [16])0x0) {
                  uVar77 = CONCAT71((int7)(uVar77 >> 8),1);
                  goto LAB_010fe5a1;
                }
                *(undefined4 *)(ray + k * 4 + 0x80) = uVar73;
                uVar22 = uVar77 & 0x3f;
                uVar77 = 0;
                uVar79 = uVar79 ^ 1L << uVar22;
                for (uVar22 = uVar79; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000)
                {
                  uVar77 = uVar77 + 1;
                }
              }
              uVar77 = 0;
            }
          }
LAB_010fe5a1:
          auVar116 = ZEXT3264(local_680);
          goto LAB_010fdfd3;
        }
      }
      uVar77 = 0;
      auVar140 = ZEXT3264(local_620);
      auVar116 = ZEXT3264(local_680);
      auVar169 = ZEXT3264(CONCAT428(fVar141,CONCAT424(fVar133,CONCAT420(fVar141,CONCAT416(fVar133,
                                                  CONCAT412(fVar141,CONCAT48(fVar133,uVar83)))))));
    }
LAB_010fdfd3:
    auVar150 = local_360;
    auVar132 = ZEXT464((uint)fVar119);
    if (8 < iVar10) {
      local_2c0._4_4_ = iVar10;
      local_2c0._0_4_ = iVar10;
      local_2c0._8_4_ = iVar10;
      local_2c0._12_4_ = iVar10;
      local_2c0._16_4_ = iVar10;
      local_2c0._20_4_ = iVar10;
      local_2c0._24_4_ = iVar10;
      local_2c0._28_4_ = iVar10;
      local_320._4_4_ = fVar119;
      local_320._0_4_ = fVar119;
      fStack_318 = fVar119;
      fStack_314 = fVar119;
      fStack_310 = fVar119;
      fStack_30c = fVar119;
      fStack_308 = fVar119;
      fStack_304 = fVar119;
      local_340._4_4_ = local_560._0_4_;
      local_340._0_4_ = local_560._0_4_;
      local_340._8_4_ = local_560._0_4_;
      local_340._12_4_ = local_560._0_4_;
      local_340._16_4_ = local_560._0_4_;
      local_340._20_4_ = local_560._0_4_;
      local_340._24_4_ = local_560._0_4_;
      local_340._28_4_ = local_560._0_4_;
      fStack_4b8 = 1.0 / (float)local_530._0_4_;
      local_530._4_4_ = (undefined4)local_728;
      local_530._0_4_ = (undefined4)local_728;
      uStack_528 = (undefined4)local_728;
      uStack_524 = (undefined4)local_728;
      local_360._4_4_ = local_480._0_4_;
      local_360._0_4_ = local_480._0_4_;
      local_360._8_4_ = local_480._0_4_;
      local_360._16_16_ = auVar150._16_16_;
      local_360._12_4_ = local_480._0_4_;
      _local_520 = auVar195._0_32_;
      local_5a0 = auVar135;
      fStack_4b4 = fStack_4b8;
      fStack_4b0 = fStack_4b8;
      fStack_4ac = fStack_4b8;
      fStack_4a8 = fStack_4b8;
      fStack_4a4 = fStack_4b8;
      local_4c0._0_4_ = fStack_4b8;
      local_4c0._4_4_ = fStack_4b8;
      for (lVar81 = 8; lVar81 < local_4f0; lVar81 = lVar81 + 8) {
        auVar181 = auVar185._0_32_;
        auVar150 = *(undefined1 (*) [32])(bezier_basis0 + lVar81 * 4 + lVar82);
        auVar147 = *(undefined1 (*) [32])(lVar82 + 0x21fb768 + lVar81 * 4);
        auVar160 = *(undefined1 (*) [32])(lVar82 + 0x21fbbec + lVar81 * 4);
        pauVar2 = (undefined1 (*) [28])(lVar82 + 0x21fc070 + lVar81 * 4);
        fVar102 = *(float *)*pauVar2;
        fVar117 = *(float *)(*pauVar2 + 4);
        fVar197 = *(float *)(*pauVar2 + 8);
        fVar205 = *(float *)(*pauVar2 + 0xc);
        fVar206 = *(float *)(*pauVar2 + 0x10);
        fVar207 = *(float *)(*pauVar2 + 0x14);
        fVar208 = *(float *)(*pauVar2 + 0x18);
        auVar72 = *pauVar2;
        auVar196._0_4_ = fVar102 * auVar175._0_4_;
        auVar196._4_4_ = fVar117 * auVar175._4_4_;
        auVar196._8_4_ = fVar197 * auVar175._8_4_;
        auVar196._12_4_ = fVar205 * auVar175._12_4_;
        auVar196._16_4_ = fVar206 * auVar175._16_4_;
        auVar196._20_4_ = fVar207 * auVar175._20_4_;
        auVar196._28_36_ = auVar195._28_36_;
        auVar196._24_4_ = fVar208 * auVar175._24_4_;
        auVar195._0_4_ = fVar102 * auVar169._0_4_;
        auVar195._4_4_ = fVar117 * auVar169._4_4_;
        auVar195._8_4_ = fVar197 * auVar169._8_4_;
        auVar195._12_4_ = fVar205 * auVar169._12_4_;
        auVar195._16_4_ = fVar206 * auVar169._16_4_;
        auVar195._20_4_ = fVar207 * auVar169._20_4_;
        auVar195._28_36_ = auVar132._28_36_;
        auVar195._24_4_ = fVar208 * auVar169._24_4_;
        auVar12 = vfmadd231ps_fma(auVar196._0_32_,auVar160,auVar204._0_32_);
        auVar13 = vfmadd231ps_fma(auVar195._0_32_,auVar160,auVar140._0_32_);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar147,auVar198._0_32_);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar147,auVar116._0_32_);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar150,auVar201);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar150,local_4a0);
        auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar81 * 4 + lVar82);
        auVar112 = *(undefined1 (*) [32])(lVar82 + 0x21fdb88 + lVar81 * 4);
        auVar14 = *(undefined1 (*) [32])(lVar82 + 0x21fe00c + lVar81 * 4);
        pfVar3 = (float *)(lVar82 + 0x21fe490 + lVar81 * 4);
        fVar209 = *pfVar3;
        fVar210 = pfVar3[1];
        fVar65 = pfVar3[2];
        fVar66 = pfVar3[3];
        fVar67 = pfVar3[4];
        fVar68 = pfVar3[5];
        fVar69 = pfVar3[6];
        auVar132._0_4_ = fVar209 * auVar175._0_4_;
        auVar132._4_4_ = fVar210 * auVar175._4_4_;
        auVar132._8_4_ = fVar65 * auVar175._8_4_;
        auVar132._12_4_ = fVar66 * auVar175._12_4_;
        auVar132._16_4_ = fVar67 * auVar175._16_4_;
        auVar132._20_4_ = fVar68 * auVar175._20_4_;
        auVar132._28_36_ = auVar175._28_36_;
        auVar132._24_4_ = fVar69 * auVar175._24_4_;
        auVar175._0_4_ = fVar209 * auVar169._0_4_;
        auVar175._4_4_ = fVar210 * auVar169._4_4_;
        auVar175._8_4_ = fVar65 * auVar169._8_4_;
        auVar175._12_4_ = fVar66 * auVar169._12_4_;
        auVar175._16_4_ = fVar67 * auVar169._16_4_;
        auVar175._20_4_ = fVar68 * auVar169._20_4_;
        auVar175._28_36_ = auVar169._28_36_;
        auVar175._24_4_ = fVar69 * auVar169._24_4_;
        auVar15 = vfmadd231ps_fma(auVar132._0_32_,auVar14,auVar204._0_32_);
        auVar16 = vfmadd231ps_fma(auVar175._0_32_,auVar14,auVar140._0_32_);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar112,auVar198._0_32_);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar112,auVar116._0_32_);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar95,auVar201);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar95,local_4a0);
        local_480 = ZEXT1632(auVar12);
        auVar19 = vsubps_avx(ZEXT1632(auVar15),local_480);
        local_560 = ZEXT1632(auVar16);
        auVar130 = ZEXT1632(auVar13);
        local_300 = vsubps_avx(local_560,auVar130);
        auVar38._4_4_ = auVar19._4_4_ * auVar13._4_4_;
        auVar38._0_4_ = auVar19._0_4_ * auVar13._0_4_;
        auVar38._8_4_ = auVar19._8_4_ * auVar13._8_4_;
        auVar38._12_4_ = auVar19._12_4_ * auVar13._12_4_;
        auVar38._16_4_ = auVar19._16_4_ * 0.0;
        auVar38._20_4_ = auVar19._20_4_ * 0.0;
        auVar38._24_4_ = auVar19._24_4_ * 0.0;
        auVar38._28_4_ = auVar204._28_4_;
        fVar119 = local_300._0_4_;
        auVar185._0_4_ = auVar12._0_4_ * fVar119;
        fVar118 = local_300._4_4_;
        auVar185._4_4_ = auVar12._4_4_ * fVar118;
        fVar97 = local_300._8_4_;
        auVar185._8_4_ = auVar12._8_4_ * fVar97;
        fVar98 = local_300._12_4_;
        auVar185._12_4_ = auVar12._12_4_ * fVar98;
        fVar99 = local_300._16_4_;
        auVar185._16_4_ = fVar99 * 0.0;
        fVar100 = local_300._20_4_;
        auVar185._20_4_ = fVar100 * 0.0;
        fVar101 = local_300._24_4_;
        auVar185._28_36_ = auVar116._28_36_;
        auVar185._24_4_ = fVar101 * 0.0;
        auVar195 = ZEXT3264(auVar160);
        auVar96 = vsubps_avx(auVar38,auVar185._0_32_);
        auVar165._0_4_ = fVar102 * (float)local_e0;
        auVar165._4_4_ = fVar117 * local_e0._4_4_;
        auVar165._8_4_ = fVar197 * (float)uStack_d8;
        auVar165._12_4_ = fVar205 * uStack_d8._4_4_;
        auVar165._16_4_ = fVar206 * (float)uStack_d0;
        auVar165._20_4_ = fVar207 * uStack_d0._4_4_;
        auVar165._24_4_ = fVar208 * (float)uStack_c8;
        auVar165._28_4_ = 0;
        auVar12 = vfmadd231ps_fma(auVar165,auVar160,local_c0);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar147,local_a0);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),local_80,auVar150);
        auVar39._4_4_ = fVar210 * local_e0._4_4_;
        auVar39._0_4_ = fVar209 * (float)local_e0;
        auVar39._8_4_ = fVar65 * (float)uStack_d8;
        auVar39._12_4_ = fVar66 * uStack_d8._4_4_;
        auVar39._16_4_ = fVar67 * (float)uStack_d0;
        auVar39._20_4_ = fVar68 * uStack_d0._4_4_;
        auVar39._24_4_ = fVar69 * (float)uStack_c8;
        auVar39._28_4_ = uStack_c8._4_4_;
        auVar17 = vfmadd231ps_fma(auVar39,auVar14,local_c0);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar112,local_a0);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar95,local_80);
        auVar40._4_4_ = fVar118 * fVar118;
        auVar40._0_4_ = fVar119 * fVar119;
        auVar40._8_4_ = fVar97 * fVar97;
        auVar40._12_4_ = fVar98 * fVar98;
        auVar40._16_4_ = fVar99 * fVar99;
        auVar40._20_4_ = fVar100 * fVar100;
        auVar40._24_4_ = fVar101 * fVar101;
        auVar40._28_4_ = local_80._28_4_;
        auVar18 = vfmadd231ps_fma(auVar40,auVar19,auVar19);
        auVar132 = ZEXT3264(local_6e0);
        auVar114 = ZEXT1632(auVar17);
        auVar89 = vmaxps_avx(ZEXT1632(auVar12),auVar114);
        auVar182._0_4_ = auVar89._0_4_ * auVar89._0_4_ * auVar18._0_4_;
        auVar182._4_4_ = auVar89._4_4_ * auVar89._4_4_ * auVar18._4_4_;
        auVar182._8_4_ = auVar89._8_4_ * auVar89._8_4_ * auVar18._8_4_;
        auVar182._12_4_ = auVar89._12_4_ * auVar89._12_4_ * auVar18._12_4_;
        auVar182._16_4_ = auVar89._16_4_ * auVar89._16_4_ * 0.0;
        auVar182._20_4_ = auVar89._20_4_ * auVar89._20_4_ * 0.0;
        auVar182._24_4_ = auVar89._24_4_ * auVar89._24_4_ * 0.0;
        auVar182._28_4_ = 0;
        auVar41._4_4_ = auVar96._4_4_ * auVar96._4_4_;
        auVar41._0_4_ = auVar96._0_4_ * auVar96._0_4_;
        auVar41._8_4_ = auVar96._8_4_ * auVar96._8_4_;
        auVar41._12_4_ = auVar96._12_4_ * auVar96._12_4_;
        auVar41._16_4_ = auVar96._16_4_ * auVar96._16_4_;
        auVar41._20_4_ = auVar96._20_4_ * auVar96._20_4_;
        auVar41._24_4_ = auVar96._24_4_ * auVar96._24_4_;
        auVar41._28_4_ = auVar96._28_4_;
        auVar89 = vcmpps_avx(auVar41,auVar182,2);
        local_1c0 = (int)lVar81;
        auVar183._4_4_ = local_1c0;
        auVar183._0_4_ = local_1c0;
        auVar183._8_4_ = local_1c0;
        auVar183._12_4_ = local_1c0;
        auVar183._16_4_ = local_1c0;
        auVar183._20_4_ = local_1c0;
        auVar183._24_4_ = local_1c0;
        auVar183._28_4_ = local_1c0;
        auVar96 = vpor_avx2(auVar183,_DAT_01fb4ba0);
        auVar21 = vpcmpgtd_avx2(local_2c0,auVar96);
        auVar96 = auVar21 & auVar89;
        if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar96 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar96 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar96 >> 0x7f,0) == '\0') &&
              (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar96 >> 0xbf,0) == '\0') &&
            (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar96[0x1f]) {
          auVar185 = ZEXT3264(auVar181);
          auVar116 = ZEXT3264(local_680);
          auVar204 = ZEXT3264(local_6e0);
          auVar175 = ZEXT3264(CONCAT428(fStack_644,
                                        CONCAT424(fStack_648,
                                                  CONCAT420(fStack_64c,
                                                            CONCAT416(fStack_650,
                                                                      CONCAT412(fStack_654,
                                                                                CONCAT48(fStack_658,
                                                                                         CONCAT44(
                                                  fStack_65c,local_660))))))));
          auVar169 = ZEXT3264(CONCAT428(fVar141,CONCAT424(fVar133,CONCAT420(fVar141,CONCAT416(
                                                  fVar133,CONCAT412(fVar141,CONCAT48(fVar133,uVar83)
                                                                   ))))));
          auVar198 = ZEXT3264(local_700);
        }
        else {
          local_2e0 = vandps_avx(auVar21,auVar89);
          auVar42._4_4_ = fVar210 * (float)local_520._4_4_;
          auVar42._0_4_ = fVar209 * (float)local_520._0_4_;
          auVar42._8_4_ = fVar65 * fStack_518;
          auVar42._12_4_ = fVar66 * fStack_514;
          auVar42._16_4_ = fVar67 * fStack_510;
          auVar42._20_4_ = fVar68 * fStack_50c;
          auVar42._24_4_ = fVar69 * fStack_508;
          auVar42._28_4_ = auVar89._28_4_;
          auVar17 = vfmadd213ps_fma(auVar14,local_460,auVar42);
          auVar17 = vfmadd213ps_fma(auVar112,local_240,ZEXT1632(auVar17));
          auVar17 = vfmadd132ps_fma(auVar95,ZEXT1632(auVar17),local_5a0);
          local_580._0_4_ = auVar72._0_4_;
          local_580._4_4_ = auVar72._4_4_;
          uStack_578._0_4_ = auVar72._8_4_;
          uStack_578._4_4_ = auVar72._12_4_;
          fStack_570 = auVar72._16_4_;
          fStack_56c = auVar72._20_4_;
          fStack_568 = auVar72._24_4_;
          auVar136._0_4_ = (float)local_520._0_4_ * (float)local_580._0_4_;
          auVar136._4_4_ = (float)local_520._4_4_ * (float)local_580._4_4_;
          auVar136._8_4_ = fStack_518 * (float)uStack_578;
          auVar136._12_4_ = fStack_514 * uStack_578._4_4_;
          auVar136._16_4_ = fStack_510 * fStack_570;
          auVar136._20_4_ = fStack_50c * fStack_56c;
          auVar136._24_4_ = fStack_508 * fStack_568;
          auVar136._28_4_ = 0;
          auVar18 = vfmadd213ps_fma(auVar160,local_460,auVar136);
          auVar18 = vfmadd213ps_fma(auVar147,local_240,ZEXT1632(auVar18));
          auVar147 = *(undefined1 (*) [32])(lVar82 + 0x21fc4f4 + lVar81 * 4);
          auVar160 = *(undefined1 (*) [32])(lVar82 + 0x21fc978 + lVar81 * 4);
          auVar95 = *(undefined1 (*) [32])(lVar82 + 0x21fcdfc + lVar81 * 4);
          pfVar4 = (float *)(lVar82 + 0x21fd280 + lVar81 * 4);
          fVar119 = *pfVar4;
          fVar118 = pfVar4[1];
          fVar97 = pfVar4[2];
          fVar98 = pfVar4[3];
          fVar99 = pfVar4[4];
          fVar100 = pfVar4[5];
          fVar101 = pfVar4[6];
          auVar43._4_4_ = fStack_65c * fVar118;
          auVar43._0_4_ = local_660 * fVar119;
          auVar43._8_4_ = fStack_658 * fVar97;
          auVar43._12_4_ = fStack_654 * fVar98;
          auVar43._16_4_ = fStack_650 * fVar99;
          auVar43._20_4_ = fStack_64c * fVar100;
          auVar43._24_4_ = fStack_648 * fVar101;
          auVar43._28_4_ = pfVar3[7];
          auVar193._0_4_ = fVar119 * fVar133;
          auVar193._4_4_ = fVar118 * fVar141;
          auVar193._8_4_ = fVar97 * fVar133;
          auVar193._12_4_ = fVar98 * fVar141;
          auVar193._16_4_ = fVar99 * fVar133;
          auVar193._20_4_ = fVar100 * fVar141;
          auVar193._24_4_ = fVar101 * fVar133;
          auVar193._28_4_ = 0;
          auVar44._4_4_ = fVar118 * (float)local_520._4_4_;
          auVar44._0_4_ = fVar119 * (float)local_520._0_4_;
          auVar44._8_4_ = fVar97 * fStack_518;
          auVar44._12_4_ = fVar98 * fStack_514;
          auVar44._16_4_ = fVar99 * fStack_510;
          auVar44._20_4_ = fVar100 * fStack_50c;
          auVar44._24_4_ = fVar101 * fStack_508;
          auVar44._28_4_ = pfVar4[7];
          auVar87 = vfmadd231ps_fma(auVar43,auVar95,local_6e0);
          auVar86 = vfmadd231ps_fma(auVar193,auVar95,local_620);
          auVar120 = vfmadd231ps_fma(auVar44,local_460,auVar95);
          auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar160,local_700);
          auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar160,local_680);
          auVar120 = vfmadd231ps_fma(ZEXT1632(auVar120),local_240,auVar160);
          auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar147,auVar201);
          auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar147,local_4a0);
          auVar120 = vfmadd231ps_fma(ZEXT1632(auVar120),auVar147,local_5a0);
          pfVar3 = (float *)(lVar82 + 0x21ff6a0 + lVar81 * 4);
          fVar119 = *pfVar3;
          fVar118 = pfVar3[1];
          fVar97 = pfVar3[2];
          fVar98 = pfVar3[3];
          fVar99 = pfVar3[4];
          fVar100 = pfVar3[5];
          fVar101 = pfVar3[6];
          auVar45._4_4_ = fStack_65c * fVar118;
          auVar45._0_4_ = local_660 * fVar119;
          auVar45._8_4_ = fStack_658 * fVar97;
          auVar45._12_4_ = fStack_654 * fVar98;
          auVar45._16_4_ = fStack_650 * fVar99;
          auVar45._20_4_ = fStack_64c * fVar100;
          auVar45._24_4_ = fStack_648 * fVar101;
          auVar45._28_4_ = fStack_644;
          auVar46._4_4_ = fVar141 * fVar118;
          auVar46._0_4_ = fVar133 * fVar119;
          auVar46._8_4_ = fVar133 * fVar97;
          auVar46._12_4_ = fVar141 * fVar98;
          auVar46._16_4_ = fVar133 * fVar99;
          auVar46._20_4_ = fVar141 * fVar100;
          auVar46._24_4_ = fVar133 * fVar101;
          auVar46._28_4_ = local_300._28_4_;
          auVar47._4_4_ = (float)local_520._4_4_ * fVar118;
          auVar47._0_4_ = (float)local_520._0_4_ * fVar119;
          auVar47._8_4_ = fStack_518 * fVar97;
          auVar47._12_4_ = fStack_514 * fVar98;
          auVar47._16_4_ = fStack_510 * fVar99;
          auVar47._20_4_ = fStack_50c * fVar100;
          auVar47._24_4_ = fStack_508 * fVar101;
          auVar47._28_4_ = pfVar3[7];
          auVar147 = *(undefined1 (*) [32])(lVar82 + 0x21ff21c + lVar81 * 4);
          auVar105 = vfmadd231ps_fma(auVar45,auVar147,local_6e0);
          auVar85 = vfmadd231ps_fma(auVar46,auVar147,local_620);
          auVar121 = vfmadd231ps_fma(auVar47,local_460,auVar147);
          auVar147 = *(undefined1 (*) [32])(lVar82 + 0x21fed98 + lVar81 * 4);
          auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar147,local_700);
          auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar147,local_680);
          auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),auVar147,local_240);
          auVar147 = *(undefined1 (*) [32])(lVar82 + 0x21fe914 + lVar81 * 4);
          auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar147,auVar201);
          auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar147,local_4a0);
          auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),local_5a0,auVar147);
          auVar184._8_4_ = 0x7fffffff;
          auVar184._0_8_ = 0x7fffffff7fffffff;
          auVar184._12_4_ = 0x7fffffff;
          auVar184._16_4_ = 0x7fffffff;
          auVar184._20_4_ = 0x7fffffff;
          auVar184._24_4_ = 0x7fffffff;
          auVar184._28_4_ = 0x7fffffff;
          auVar147 = vandps_avx(ZEXT1632(auVar87),auVar184);
          auVar160 = vandps_avx(ZEXT1632(auVar86),auVar184);
          auVar160 = vmaxps_avx(auVar147,auVar160);
          auVar147 = vandps_avx(ZEXT1632(auVar120),auVar184);
          auVar147 = vmaxps_avx(auVar160,auVar147);
          auVar147 = vcmpps_avx(auVar147,_local_320,1);
          auVar95 = vblendvps_avx(ZEXT1632(auVar87),auVar19,auVar147);
          auVar112 = vblendvps_avx(ZEXT1632(auVar86),local_300,auVar147);
          auVar147 = vandps_avx(ZEXT1632(auVar105),auVar184);
          auVar160 = vandps_avx(ZEXT1632(auVar85),auVar184);
          auVar160 = vmaxps_avx(auVar147,auVar160);
          auVar147 = vandps_avx(auVar184,ZEXT1632(auVar121));
          auVar147 = vmaxps_avx(auVar160,auVar147);
          auVar160 = vcmpps_avx(auVar147,_local_320,1);
          auVar147 = vblendvps_avx(ZEXT1632(auVar105),auVar19,auVar160);
          auVar160 = vblendvps_avx(ZEXT1632(auVar85),local_300,auVar160);
          auVar18 = vfmadd213ps_fma(auVar150,local_5a0,ZEXT1632(auVar18));
          auVar87 = vfmadd213ps_fma(auVar95,auVar95,ZEXT832(0) << 0x20);
          auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar112,auVar112);
          auVar150 = vrsqrtps_avx(ZEXT1632(auVar87));
          fVar119 = auVar150._0_4_;
          fVar118 = auVar150._4_4_;
          fVar97 = auVar150._8_4_;
          fVar98 = auVar150._12_4_;
          fVar99 = auVar150._16_4_;
          fVar100 = auVar150._20_4_;
          fVar101 = auVar150._24_4_;
          auVar48._4_4_ = fVar118 * fVar118 * fVar118 * auVar87._4_4_ * -0.5;
          auVar48._0_4_ = fVar119 * fVar119 * fVar119 * auVar87._0_4_ * -0.5;
          auVar48._8_4_ = fVar97 * fVar97 * fVar97 * auVar87._8_4_ * -0.5;
          auVar48._12_4_ = fVar98 * fVar98 * fVar98 * auVar87._12_4_ * -0.5;
          auVar48._16_4_ = fVar99 * fVar99 * fVar99 * -0.0;
          auVar48._20_4_ = fVar100 * fVar100 * fVar100 * -0.0;
          auVar48._24_4_ = fVar101 * fVar101 * fVar101 * -0.0;
          auVar48._28_4_ = 0;
          auVar203._8_4_ = 0x3fc00000;
          auVar203._0_8_ = 0x3fc000003fc00000;
          auVar203._12_4_ = 0x3fc00000;
          auVar203._16_4_ = 0x3fc00000;
          auVar203._20_4_ = 0x3fc00000;
          auVar203._24_4_ = 0x3fc00000;
          auVar203._28_4_ = 0x3fc00000;
          auVar87 = vfmadd231ps_fma(auVar48,auVar203,auVar150);
          fVar119 = auVar87._0_4_;
          fVar118 = auVar87._4_4_;
          auVar49._4_4_ = auVar112._4_4_ * fVar118;
          auVar49._0_4_ = auVar112._0_4_ * fVar119;
          fVar97 = auVar87._8_4_;
          auVar49._8_4_ = auVar112._8_4_ * fVar97;
          fVar98 = auVar87._12_4_;
          auVar49._12_4_ = auVar112._12_4_ * fVar98;
          auVar49._16_4_ = auVar112._16_4_ * 0.0;
          auVar49._20_4_ = auVar112._20_4_ * 0.0;
          auVar49._24_4_ = auVar112._24_4_ * 0.0;
          auVar49._28_4_ = auVar150._28_4_;
          auVar50._4_4_ = fVar118 * -auVar95._4_4_;
          auVar50._0_4_ = fVar119 * -auVar95._0_4_;
          auVar50._8_4_ = fVar97 * -auVar95._8_4_;
          auVar50._12_4_ = fVar98 * -auVar95._12_4_;
          auVar50._16_4_ = -auVar95._16_4_ * 0.0;
          auVar50._20_4_ = -auVar95._20_4_ * 0.0;
          auVar50._24_4_ = -auVar95._24_4_ * 0.0;
          auVar50._28_4_ = auVar112._28_4_;
          auVar87 = vfmadd213ps_fma(auVar147,auVar147,ZEXT832(0) << 0x20);
          auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar160,auVar160);
          auVar150 = vrsqrtps_avx(ZEXT1632(auVar87));
          auVar51._28_4_ = uStack_504;
          auVar51._0_28_ =
               ZEXT1628(CONCAT412(fVar98 * 0.0,
                                  CONCAT48(fVar97 * 0.0,CONCAT44(fVar118 * 0.0,fVar119 * 0.0))));
          fVar119 = auVar150._0_4_;
          fVar118 = auVar150._4_4_;
          fVar97 = auVar150._8_4_;
          fVar98 = auVar150._12_4_;
          fVar99 = auVar150._16_4_;
          fVar100 = auVar150._20_4_;
          fVar101 = auVar150._24_4_;
          auVar52._4_4_ = fVar118 * fVar118 * fVar118 * auVar87._4_4_ * -0.5;
          auVar52._0_4_ = fVar119 * fVar119 * fVar119 * auVar87._0_4_ * -0.5;
          auVar52._8_4_ = fVar97 * fVar97 * fVar97 * auVar87._8_4_ * -0.5;
          auVar52._12_4_ = fVar98 * fVar98 * fVar98 * auVar87._12_4_ * -0.5;
          auVar52._16_4_ = fVar99 * fVar99 * fVar99 * -0.0;
          auVar52._20_4_ = fVar100 * fVar100 * fVar100 * -0.0;
          auVar52._24_4_ = fVar101 * fVar101 * fVar101 * -0.0;
          auVar52._28_4_ = 0;
          auVar87 = vfmadd231ps_fma(auVar52,auVar203,auVar150);
          fVar119 = auVar87._0_4_;
          fVar118 = auVar87._4_4_;
          auVar53._4_4_ = auVar160._4_4_ * fVar118;
          auVar53._0_4_ = auVar160._0_4_ * fVar119;
          fVar97 = auVar87._8_4_;
          auVar53._8_4_ = auVar160._8_4_ * fVar97;
          fVar98 = auVar87._12_4_;
          auVar53._12_4_ = auVar160._12_4_ * fVar98;
          auVar53._16_4_ = auVar160._16_4_ * 0.0;
          auVar53._20_4_ = auVar160._20_4_ * 0.0;
          auVar53._24_4_ = auVar160._24_4_ * 0.0;
          auVar53._28_4_ = 0;
          auVar54._4_4_ = fVar118 * -auVar147._4_4_;
          auVar54._0_4_ = fVar119 * -auVar147._0_4_;
          auVar54._8_4_ = fVar97 * -auVar147._8_4_;
          auVar54._12_4_ = fVar98 * -auVar147._12_4_;
          auVar54._16_4_ = -auVar147._16_4_ * 0.0;
          auVar54._20_4_ = -auVar147._20_4_ * 0.0;
          auVar54._24_4_ = -auVar147._24_4_ * 0.0;
          auVar54._28_4_ = auVar150._28_4_;
          auVar55._28_4_ = 0xbf000000;
          auVar55._0_28_ =
               ZEXT1628(CONCAT412(fVar98 * 0.0,
                                  CONCAT48(fVar97 * 0.0,CONCAT44(fVar118 * 0.0,fVar119 * 0.0))));
          auVar87 = vfmadd213ps_fma(auVar49,ZEXT1632(auVar12),local_480);
          auVar150 = ZEXT1632(auVar12);
          auVar86 = vfmadd213ps_fma(auVar50,auVar150,auVar130);
          auVar120 = vfmadd213ps_fma(auVar51,auVar150,ZEXT1632(auVar18));
          auVar121 = vfnmadd213ps_fma(auVar49,auVar150,local_480);
          auVar105 = vfmadd213ps_fma(auVar53,auVar114,ZEXT1632(auVar15));
          auVar134 = vfnmadd213ps_fma(auVar50,auVar150,auVar130);
          auVar85 = vfmadd213ps_fma(auVar54,auVar114,local_560);
          auVar166 = ZEXT1632(auVar12);
          auVar12 = vfnmadd231ps_fma(ZEXT1632(auVar18),auVar166,auVar51);
          auVar18 = vfmadd213ps_fma(auVar55,auVar114,ZEXT1632(auVar17));
          auVar143 = vfnmadd213ps_fma(auVar53,auVar114,ZEXT1632(auVar15));
          auVar84 = vfnmadd213ps_fma(auVar54,auVar114,local_560);
          auVar104 = vfnmadd231ps_fma(ZEXT1632(auVar17),auVar114,auVar55);
          auVar150 = vsubps_avx(ZEXT1632(auVar85),ZEXT1632(auVar134));
          auVar147 = vsubps_avx(ZEXT1632(auVar18),ZEXT1632(auVar12));
          auVar167._0_4_ = auVar150._0_4_ * auVar12._0_4_;
          auVar167._4_4_ = auVar150._4_4_ * auVar12._4_4_;
          auVar167._8_4_ = auVar150._8_4_ * auVar12._8_4_;
          auVar167._12_4_ = auVar150._12_4_ * auVar12._12_4_;
          auVar167._16_4_ = auVar150._16_4_ * 0.0;
          auVar167._20_4_ = auVar150._20_4_ * 0.0;
          auVar167._24_4_ = auVar150._24_4_ * 0.0;
          auVar167._28_4_ = 0;
          auVar15 = vfmsub231ps_fma(auVar167,ZEXT1632(auVar134),auVar147);
          auVar56._4_4_ = auVar121._4_4_ * auVar147._4_4_;
          auVar56._0_4_ = auVar121._0_4_ * auVar147._0_4_;
          auVar56._8_4_ = auVar121._8_4_ * auVar147._8_4_;
          auVar56._12_4_ = auVar121._12_4_ * auVar147._12_4_;
          auVar56._16_4_ = auVar147._16_4_ * 0.0;
          auVar56._20_4_ = auVar147._20_4_ * 0.0;
          auVar56._24_4_ = auVar147._24_4_ * 0.0;
          auVar56._28_4_ = auVar147._28_4_;
          auVar89 = ZEXT1632(auVar121);
          auVar147 = vsubps_avx(ZEXT1632(auVar105),auVar89);
          auVar96 = ZEXT1632(auVar12);
          auVar12 = vfmsub231ps_fma(auVar56,auVar96,auVar147);
          auVar57._4_4_ = auVar134._4_4_ * auVar147._4_4_;
          auVar57._0_4_ = auVar134._0_4_ * auVar147._0_4_;
          auVar57._8_4_ = auVar134._8_4_ * auVar147._8_4_;
          auVar57._12_4_ = auVar134._12_4_ * auVar147._12_4_;
          auVar57._16_4_ = auVar147._16_4_ * 0.0;
          auVar57._20_4_ = auVar147._20_4_ * 0.0;
          auVar57._24_4_ = auVar147._24_4_ * 0.0;
          auVar57._28_4_ = auVar147._28_4_;
          auVar17 = vfmsub231ps_fma(auVar57,auVar89,auVar150);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
          auVar21 = vcmpps_avx(ZEXT1632(auVar12),ZEXT832(0) << 0x20,2);
          auVar150 = vblendvps_avx(ZEXT1632(auVar143),ZEXT1632(auVar87),auVar21);
          auVar147 = vblendvps_avx(ZEXT1632(auVar84),ZEXT1632(auVar86),auVar21);
          auVar160 = vblendvps_avx(ZEXT1632(auVar104),ZEXT1632(auVar120),auVar21);
          auVar95 = vblendvps_avx(auVar89,ZEXT1632(auVar105),auVar21);
          auVar112 = vblendvps_avx(ZEXT1632(auVar134),ZEXT1632(auVar85),auVar21);
          auVar14 = vblendvps_avx(auVar96,ZEXT1632(auVar18),auVar21);
          auVar89 = vblendvps_avx(ZEXT1632(auVar105),auVar89,auVar21);
          auVar19 = vblendvps_avx(ZEXT1632(auVar85),ZEXT1632(auVar134),auVar21);
          auVar12 = vpackssdw_avx(local_2e0._0_16_,local_2e0._16_16_);
          auVar96 = vblendvps_avx(ZEXT1632(auVar18),auVar96,auVar21);
          auVar89 = vsubps_avx(auVar89,auVar150);
          auVar19 = vsubps_avx(auVar19,auVar147);
          auVar130 = vsubps_avx(auVar96,auVar160);
          auVar195 = ZEXT3264(auVar130);
          auVar90 = vsubps_avx(auVar150,auVar95);
          auVar108 = vsubps_avx(auVar147,auVar112);
          auVar135 = vsubps_avx(auVar160,auVar14);
          auVar157._0_4_ = auVar130._0_4_ * auVar150._0_4_;
          auVar157._4_4_ = auVar130._4_4_ * auVar150._4_4_;
          auVar157._8_4_ = auVar130._8_4_ * auVar150._8_4_;
          auVar157._12_4_ = auVar130._12_4_ * auVar150._12_4_;
          auVar157._16_4_ = auVar130._16_4_ * auVar150._16_4_;
          auVar157._20_4_ = auVar130._20_4_ * auVar150._20_4_;
          auVar157._24_4_ = auVar130._24_4_ * auVar150._24_4_;
          auVar157._28_4_ = 0;
          auVar15 = vfmsub231ps_fma(auVar157,auVar160,auVar89);
          auVar58._4_4_ = auVar89._4_4_ * auVar147._4_4_;
          auVar58._0_4_ = auVar89._0_4_ * auVar147._0_4_;
          auVar58._8_4_ = auVar89._8_4_ * auVar147._8_4_;
          auVar58._12_4_ = auVar89._12_4_ * auVar147._12_4_;
          auVar58._16_4_ = auVar89._16_4_ * auVar147._16_4_;
          auVar58._20_4_ = auVar89._20_4_ * auVar147._20_4_;
          auVar58._24_4_ = auVar89._24_4_ * auVar147._24_4_;
          auVar58._28_4_ = auVar96._28_4_;
          auVar17 = vfmsub231ps_fma(auVar58,auVar150,auVar19);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT1632(auVar15),_DAT_01f7b000);
          auVar158._0_4_ = auVar19._0_4_ * auVar160._0_4_;
          auVar158._4_4_ = auVar19._4_4_ * auVar160._4_4_;
          auVar158._8_4_ = auVar19._8_4_ * auVar160._8_4_;
          auVar158._12_4_ = auVar19._12_4_ * auVar160._12_4_;
          auVar158._16_4_ = auVar19._16_4_ * auVar160._16_4_;
          auVar158._20_4_ = auVar19._20_4_ * auVar160._20_4_;
          auVar158._24_4_ = auVar19._24_4_ * auVar160._24_4_;
          auVar158._28_4_ = 0;
          auVar17 = vfmsub231ps_fma(auVar158,auVar147,auVar130);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
          auVar132 = ZEXT1664(auVar17);
          auVar159._0_4_ = auVar135._0_4_ * auVar95._0_4_;
          auVar159._4_4_ = auVar135._4_4_ * auVar95._4_4_;
          auVar159._8_4_ = auVar135._8_4_ * auVar95._8_4_;
          auVar159._12_4_ = auVar135._12_4_ * auVar95._12_4_;
          auVar159._16_4_ = auVar135._16_4_ * auVar95._16_4_;
          auVar159._20_4_ = auVar135._20_4_ * auVar95._20_4_;
          auVar159._24_4_ = auVar135._24_4_ * auVar95._24_4_;
          auVar159._28_4_ = 0;
          auVar15 = vfmsub231ps_fma(auVar159,auVar90,auVar14);
          auVar59._4_4_ = auVar108._4_4_ * auVar14._4_4_;
          auVar59._0_4_ = auVar108._0_4_ * auVar14._0_4_;
          auVar59._8_4_ = auVar108._8_4_ * auVar14._8_4_;
          auVar59._12_4_ = auVar108._12_4_ * auVar14._12_4_;
          auVar59._16_4_ = auVar108._16_4_ * auVar14._16_4_;
          auVar59._20_4_ = auVar108._20_4_ * auVar14._20_4_;
          auVar59._24_4_ = auVar108._24_4_ * auVar14._24_4_;
          auVar59._28_4_ = auVar14._28_4_;
          auVar18 = vfmsub231ps_fma(auVar59,auVar112,auVar135);
          auVar60._4_4_ = auVar90._4_4_ * auVar112._4_4_;
          auVar60._0_4_ = auVar90._0_4_ * auVar112._0_4_;
          auVar60._8_4_ = auVar90._8_4_ * auVar112._8_4_;
          auVar60._12_4_ = auVar90._12_4_ * auVar112._12_4_;
          auVar60._16_4_ = auVar90._16_4_ * auVar112._16_4_;
          auVar60._20_4_ = auVar90._20_4_ * auVar112._20_4_;
          auVar60._24_4_ = auVar90._24_4_ * auVar112._24_4_;
          auVar60._28_4_ = auVar112._28_4_;
          auVar87 = vfmsub231ps_fma(auVar60,auVar108,auVar95);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar87),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar18));
          auVar95 = vmaxps_avx(ZEXT1632(auVar17),ZEXT1632(auVar18));
          auVar95 = vcmpps_avx(auVar95,ZEXT832(0) << 0x20,2);
          auVar15 = vpackssdw_avx(auVar95._0_16_,auVar95._16_16_);
          auVar12 = vpand_avx(auVar15,auVar12);
          auVar95 = vpmovsxwd_avx2(auVar12);
          if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar95 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar95 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar95 >> 0x7f,0) == '\0') &&
                (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar95 >> 0xbf,0) == '\0') &&
              (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar95[0x1f]) {
LAB_010ff31f:
            auVar139._8_8_ = uStack_4d8;
            auVar139._0_8_ = local_4e0;
            auVar139._16_8_ = uStack_4d0;
            auVar139._24_8_ = uStack_4c8;
            auVar191 = ZEXT3264(auVar191._0_32_);
            auVar185 = ZEXT3264(auVar181);
          }
          else {
            auVar61._4_4_ = auVar19._4_4_ * auVar135._4_4_;
            auVar61._0_4_ = auVar19._0_4_ * auVar135._0_4_;
            auVar61._8_4_ = auVar19._8_4_ * auVar135._8_4_;
            auVar61._12_4_ = auVar19._12_4_ * auVar135._12_4_;
            auVar61._16_4_ = auVar19._16_4_ * auVar135._16_4_;
            auVar61._20_4_ = auVar19._20_4_ * auVar135._20_4_;
            auVar61._24_4_ = auVar19._24_4_ * auVar135._24_4_;
            auVar61._28_4_ = auVar95._28_4_;
            auVar120 = vfmsub231ps_fma(auVar61,auVar108,auVar130);
            auVar168._0_4_ = auVar130._0_4_ * auVar90._0_4_;
            auVar168._4_4_ = auVar130._4_4_ * auVar90._4_4_;
            auVar168._8_4_ = auVar130._8_4_ * auVar90._8_4_;
            auVar168._12_4_ = auVar130._12_4_ * auVar90._12_4_;
            auVar168._16_4_ = auVar130._16_4_ * auVar90._16_4_;
            auVar168._20_4_ = auVar130._20_4_ * auVar90._20_4_;
            auVar168._24_4_ = auVar130._24_4_ * auVar90._24_4_;
            auVar168._28_4_ = 0;
            auVar86 = vfmsub231ps_fma(auVar168,auVar89,auVar135);
            auVar62._4_4_ = auVar89._4_4_ * auVar108._4_4_;
            auVar62._0_4_ = auVar89._0_4_ * auVar108._0_4_;
            auVar62._8_4_ = auVar89._8_4_ * auVar108._8_4_;
            auVar62._12_4_ = auVar89._12_4_ * auVar108._12_4_;
            auVar62._16_4_ = auVar89._16_4_ * auVar108._16_4_;
            auVar62._20_4_ = auVar89._20_4_ * auVar108._20_4_;
            auVar62._24_4_ = auVar89._24_4_ * auVar108._24_4_;
            auVar62._28_4_ = auVar108._28_4_;
            auVar105 = vfmsub231ps_fma(auVar62,auVar90,auVar19);
            auVar15 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar86),ZEXT1632(auVar105));
            auVar87 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT1632(auVar120),ZEXT832(0) << 0x20);
            auVar95 = vrcpps_avx(ZEXT1632(auVar87));
            auVar194._8_4_ = 0x3f800000;
            auVar194._0_8_ = 0x3f8000003f800000;
            auVar194._12_4_ = 0x3f800000;
            auVar194._16_4_ = 0x3f800000;
            auVar194._20_4_ = 0x3f800000;
            auVar194._24_4_ = 0x3f800000;
            auVar194._28_4_ = 0x3f800000;
            auVar195 = ZEXT3264(auVar194);
            auVar15 = vfnmadd213ps_fma(auVar95,ZEXT1632(auVar87),auVar194);
            auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar95,auVar95);
            auVar137._0_4_ = auVar105._0_4_ * auVar160._0_4_;
            auVar137._4_4_ = auVar105._4_4_ * auVar160._4_4_;
            auVar137._8_4_ = auVar105._8_4_ * auVar160._8_4_;
            auVar137._12_4_ = auVar105._12_4_ * auVar160._12_4_;
            auVar137._16_4_ = auVar160._16_4_ * 0.0;
            auVar137._20_4_ = auVar160._20_4_ * 0.0;
            auVar137._24_4_ = auVar160._24_4_ * 0.0;
            auVar137._28_4_ = 0;
            auVar86 = vfmadd231ps_fma(auVar137,ZEXT1632(auVar86),auVar147);
            auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar150,ZEXT1632(auVar120));
            fVar119 = auVar15._0_4_;
            fVar118 = auVar15._4_4_;
            fVar97 = auVar15._8_4_;
            fVar98 = auVar15._12_4_;
            auVar160 = ZEXT1632(CONCAT412(fVar98 * auVar86._12_4_,
                                          CONCAT48(fVar97 * auVar86._8_4_,
                                                   CONCAT44(fVar118 * auVar86._4_4_,
                                                            fVar119 * auVar86._0_4_))));
            uVar73 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar138._4_4_ = uVar73;
            auVar138._0_4_ = uVar73;
            auVar138._8_4_ = uVar73;
            auVar138._12_4_ = uVar73;
            auVar138._16_4_ = uVar73;
            auVar138._20_4_ = uVar73;
            auVar138._24_4_ = uVar73;
            auVar138._28_4_ = uVar73;
            auVar150 = vcmpps_avx(local_340,auVar160,2);
            auVar147 = vcmpps_avx(auVar160,auVar138,2);
            auVar150 = vandps_avx(auVar147,auVar150);
            auVar15 = vpackssdw_avx(auVar150._0_16_,auVar150._16_16_);
            auVar12 = vpand_avx(auVar12,auVar15);
            auVar150 = vpmovsxwd_avx2(auVar12);
            if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar150 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar150 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar150 >> 0x7f,0) == '\0') &&
                  (auVar150 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar150 >> 0xbf,0) == '\0') &&
                (auVar150 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar150[0x1f]) goto LAB_010ff31f;
            auVar150 = vcmpps_avx(ZEXT1632(auVar87),ZEXT832(0) << 0x20,4);
            auVar15 = vpackssdw_avx(auVar150._0_16_,auVar150._16_16_);
            auVar12 = vpand_avx(auVar12,auVar15);
            auVar150 = vpmovsxwd_avx2(auVar12);
            auVar139._8_8_ = uStack_4d8;
            auVar139._0_8_ = local_4e0;
            auVar139._16_8_ = uStack_4d0;
            auVar139._24_8_ = uStack_4c8;
            auVar191 = ZEXT3264(auVar191._0_32_);
            auVar185 = ZEXT3264(auVar181);
            if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar150 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar150 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar150 >> 0x7f,0) != '\0') ||
                  (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar150 >> 0xbf,0) != '\0') ||
                (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar150[0x1f] < '\0') {
              auVar95 = ZEXT1632(CONCAT412(fVar98 * auVar17._12_4_,
                                           CONCAT48(fVar97 * auVar17._8_4_,
                                                    CONCAT44(fVar118 * auVar17._4_4_,
                                                             fVar119 * auVar17._0_4_))));
              auVar63._28_4_ = SUB84(uStack_4c8,4);
              auVar63._0_28_ =
                   ZEXT1628(CONCAT412(fVar98 * auVar18._12_4_,
                                      CONCAT48(fVar97 * auVar18._8_4_,
                                               CONCAT44(fVar118 * auVar18._4_4_,
                                                        fVar119 * auVar18._0_4_))));
              auVar177._8_4_ = 0x3f800000;
              auVar177._0_8_ = 0x3f8000003f800000;
              auVar177._12_4_ = 0x3f800000;
              auVar177._16_4_ = 0x3f800000;
              auVar177._20_4_ = 0x3f800000;
              auVar177._24_4_ = 0x3f800000;
              auVar177._28_4_ = 0x3f800000;
              auVar147 = vsubps_avx(auVar177,auVar95);
              auVar147 = vblendvps_avx(auVar147,auVar95,auVar21);
              auVar191 = ZEXT3264(auVar147);
              auVar147 = vsubps_avx(auVar177,auVar63);
              local_3a0 = vblendvps_avx(auVar147,auVar63,auVar21);
              auVar132 = ZEXT3264(local_3a0);
              auVar185 = ZEXT3264(auVar160);
              auVar139 = auVar150;
            }
          }
          auVar204 = ZEXT3264(local_6e0);
          auVar198 = ZEXT3264(local_700);
          if ((((((((auVar139 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar139 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar139 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar139 >> 0x7f,0) == '\0') &&
                (auVar139 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar139 >> 0xbf,0) == '\0') &&
              (auVar139 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar139[0x1f]) {
            auVar116 = ZEXT3264(local_680);
            auVar175 = ZEXT3264(CONCAT428(fStack_644,
                                          CONCAT424(fStack_648,
                                                    CONCAT420(fStack_64c,
                                                              CONCAT416(fStack_650,
                                                                        CONCAT412(fStack_654,
                                                                                  CONCAT48(
                                                  fStack_658,CONCAT44(fStack_65c,local_660))))))));
            auVar169 = ZEXT3264(CONCAT428(fVar141,CONCAT424(fVar133,CONCAT420(fVar141,CONCAT416(
                                                  fVar133,CONCAT412(fVar141,CONCAT48(fVar133,uVar83)
                                                                   ))))));
          }
          else {
            auVar150 = vsubps_avx(auVar114,auVar166);
            local_6c0 = auVar191._0_32_;
            auVar12 = vfmadd213ps_fma(auVar150,local_6c0,auVar166);
            fVar119 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
            auVar64._4_4_ = (auVar12._4_4_ + auVar12._4_4_) * fVar119;
            auVar64._0_4_ = (auVar12._0_4_ + auVar12._0_4_) * fVar119;
            auVar64._8_4_ = (auVar12._8_4_ + auVar12._8_4_) * fVar119;
            auVar64._12_4_ = (auVar12._12_4_ + auVar12._12_4_) * fVar119;
            auVar64._16_4_ = fVar119 * 0.0;
            auVar64._20_4_ = fVar119 * 0.0;
            auVar64._24_4_ = fVar119 * 0.0;
            auVar64._28_4_ = fVar119;
            local_720 = auVar185._0_32_;
            auVar150 = vcmpps_avx(local_720,auVar64,6);
            auVar147 = auVar139 & auVar150;
            auVar175 = ZEXT3264(CONCAT428(fStack_644,
                                          CONCAT424(fStack_648,
                                                    CONCAT420(fStack_64c,
                                                              CONCAT416(fStack_650,
                                                                        CONCAT412(fStack_654,
                                                                                  CONCAT48(
                                                  fStack_658,CONCAT44(fStack_65c,local_660))))))));
            auVar169 = ZEXT3264(CONCAT428(fVar141,CONCAT424(fVar133,CONCAT420(fVar141,CONCAT416(
                                                  fVar133,CONCAT412(fVar141,CONCAT48(fVar133,uVar83)
                                                                   ))))));
            if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar147 >> 0x7f,0) == '\0') &&
                  (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar147 >> 0xbf,0) == '\0') &&
                (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar147[0x1f]) {
              auVar116 = ZEXT3264(local_680);
            }
            else {
              auVar115._8_4_ = 0xbf800000;
              auVar115._0_8_ = 0xbf800000bf800000;
              auVar115._12_4_ = 0xbf800000;
              auVar115._16_4_ = 0xbf800000;
              auVar115._20_4_ = 0xbf800000;
              auVar115._24_4_ = 0xbf800000;
              auVar115._28_4_ = 0xbf800000;
              auVar131._8_4_ = 0x40000000;
              auVar131._0_8_ = 0x4000000040000000;
              auVar131._12_4_ = 0x40000000;
              auVar131._16_4_ = 0x40000000;
              auVar131._20_4_ = 0x40000000;
              auVar131._24_4_ = 0x40000000;
              auVar131._28_4_ = 0x40000000;
              auVar132 = ZEXT3264(auVar131);
              auVar12 = vfmadd213ps_fma(local_3a0,auVar131,auVar115);
              local_200 = ZEXT1632(auVar12);
              local_1b0 = local_630;
              uStack_1a8 = uStack_628;
              local_1a0 = local_5f0._0_8_;
              uStack_198 = local_5f0._8_8_;
              local_190 = local_600._0_8_;
              uStack_188 = local_600._8_8_;
              pGVar75 = (context->scene->geometries).items[local_728].ptr;
              local_3a0 = local_200;
              if ((pGVar75->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                pRVar76 = (RTCIntersectArguments *)0x0;
                auVar116 = ZEXT3264(local_680);
              }
              else {
                pRVar76 = context->args;
                auVar116 = ZEXT3264(local_680);
                if ((pRVar76->filter != (RTCFilterFunctionN)0x0) ||
                   (pRVar76 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar76 >> 8),1),
                   pGVar75->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_560 = ZEXT1632(CONCAT124(auVar16._4_12_,(int)uVar77));
                  auVar150 = vandps_avx(auVar150,auVar139);
                  fVar119 = (float)local_1c0;
                  auVar132 = ZEXT3264(CONCAT428(fVar119,CONCAT424(fVar119,CONCAT420(fVar119,
                                                  CONCAT416(fVar119,CONCAT412(fVar119,CONCAT48(
                                                  fVar119,CONCAT44(fVar119,fVar119))))))));
                  local_140[0] = (fVar119 + auVar191._0_4_ + 0.0) * (float)local_4c0;
                  local_140[1] = (fVar119 + auVar191._4_4_ + 1.0) * local_4c0._4_4_;
                  local_140[2] = (fVar119 + auVar191._8_4_ + 2.0) * fStack_4b8;
                  local_140[3] = (fVar119 + auVar191._12_4_ + 3.0) * fStack_4b4;
                  fStack_130 = (fVar119 + auVar191._16_4_ + 4.0) * fStack_4b0;
                  fStack_12c = (fVar119 + auVar191._20_4_ + 5.0) * fStack_4ac;
                  fStack_128 = (fVar119 + auVar191._24_4_ + 6.0) * fStack_4a8;
                  fStack_124 = fVar119 + auVar191._28_4_ + 7.0;
                  local_3a0._0_8_ = auVar12._0_8_;
                  local_3a0._8_8_ = auVar12._8_8_;
                  local_120 = local_3a0._0_8_;
                  uStack_118 = local_3a0._8_8_;
                  uStack_110 = 0;
                  uStack_108 = 0;
                  local_100 = local_720;
                  uVar73 = vmovmskps_avx(auVar150);
                  uVar77 = 0;
                  uVar79 = CONCAT44((int)((ulong)pRVar76 >> 0x20),uVar73);
                  for (uVar22 = uVar79; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000
                      ) {
                    uVar77 = uVar77 + 1;
                  }
                  local_6a0 = ZEXT1632(CONCAT88(auVar13._8_8_,pGVar75));
                  _local_580 = auVar114;
                  local_220 = local_6c0;
                  local_1e0 = local_720;
                  local_1bc = iVar10;
                  while (uVar79 != 0) {
                    uVar73 = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_400 = local_140[uVar77];
                    local_3f0 = *(undefined4 *)((long)&local_120 + uVar77 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_100 + uVar77 * 4);
                    fVar97 = 1.0 - local_400;
                    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar97 * fVar97)),
                                              ZEXT416((uint)(local_400 * fVar97)),
                                              ZEXT416(0xc0000000));
                    auVar12 = vfmsub132ss_fma(ZEXT416((uint)(local_400 * fVar97)),
                                              ZEXT416((uint)(local_400 * local_400)),
                                              ZEXT416(0x40000000));
                    fVar119 = auVar12._0_4_ * 3.0;
                    fVar118 = local_400 * local_400 * 3.0;
                    auVar155._0_4_ = fVar118 * (float)local_500._0_4_;
                    auVar155._4_4_ = fVar118 * (float)local_500._4_4_;
                    auVar155._8_4_ = fVar118 * fStack_4f8;
                    auVar155._12_4_ = fVar118 * fStack_4f4;
                    auVar125._4_4_ = fVar119;
                    auVar125._0_4_ = fVar119;
                    auVar125._8_4_ = fVar119;
                    auVar125._12_4_ = fVar119;
                    auVar12 = vfmadd132ps_fma(auVar125,auVar155,local_600);
                    fVar119 = auVar13._0_4_ * 3.0;
                    auVar146._4_4_ = fVar119;
                    auVar146._0_4_ = fVar119;
                    auVar146._8_4_ = fVar119;
                    auVar146._12_4_ = fVar119;
                    auVar12 = vfmadd132ps_fma(auVar146,auVar12,local_5f0);
                    fVar119 = fVar97 * fVar97 * -3.0;
                    local_5d0.context = context->user;
                    auVar126._4_4_ = fVar119;
                    auVar126._0_4_ = fVar119;
                    auVar126._8_4_ = fVar119;
                    auVar126._12_4_ = fVar119;
                    auVar71._8_8_ = uStack_628;
                    auVar71._0_8_ = local_630;
                    auVar12 = vfmadd132ps_fma(auVar126,auVar12,auVar71);
                    local_430 = auVar12._0_4_;
                    local_420 = vshufps_avx(auVar12,auVar12,0x55);
                    local_410 = vshufps_avx(auVar12,auVar12,0xaa);
                    auVar132 = ZEXT1664(local_410);
                    local_3e0 = local_360._0_8_;
                    uStack_3d8 = local_360._8_8_;
                    local_3d0 = _local_530;
                    vpcmpeqd_avx2(ZEXT1632(_local_530),ZEXT1632(_local_530));
                    uStack_3bc = (local_5d0.context)->instID[0];
                    local_3c0 = uStack_3bc;
                    uStack_3b8 = uStack_3bc;
                    uStack_3b4 = uStack_3bc;
                    uStack_3b0 = (local_5d0.context)->instPrimID[0];
                    uStack_3ac = uStack_3b0;
                    uStack_3a8 = uStack_3b0;
                    uStack_3a4 = uStack_3b0;
                    local_740 = *local_5d8;
                    local_5d0.valid = (int *)local_740;
                    local_5d0.geometryUserPtr = pGVar75->userPtr;
                    local_5d0.hit = (RTCHitN *)&local_430;
                    local_5d0.N = 4;
                    local_5d0.ray = (RTCRayN *)ray;
                    uStack_42c = local_430;
                    uStack_428 = local_430;
                    uStack_424 = local_430;
                    fStack_3fc = local_400;
                    fStack_3f8 = local_400;
                    fStack_3f4 = local_400;
                    uStack_3ec = local_3f0;
                    uStack_3e8 = local_3f0;
                    uStack_3e4 = local_3f0;
                    if (pGVar75->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar132 = ZEXT1664(local_410);
                      auVar195 = ZEXT1664(auVar195._0_16_);
                      (*pGVar75->occlusionFilterN)(&local_5d0);
                    }
                    if (local_740 == (undefined1  [16])0x0) {
                      auVar12 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar12 = auVar12 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var11 = context->args->filter;
                      if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_6a0._0_8_ + 0x3e) & 0x40) != 0)))) {
                        auVar195 = ZEXT1664(auVar195._0_16_);
                        (*p_Var11)(&local_5d0);
                      }
                      auVar13 = vpcmpeqd_avx(local_740,_DAT_01f45a50);
                      auVar12 = auVar13 ^ _DAT_01f46b70;
                      auVar127._8_4_ = 0xff800000;
                      auVar127._0_8_ = 0xff800000ff800000;
                      auVar127._12_4_ = 0xff800000;
                      auVar132 = ZEXT1664(auVar127);
                      auVar13 = vblendvps_avx(auVar127,*(undefined1 (*) [16])(local_5d0.ray + 0x80),
                                              auVar13);
                      *(undefined1 (*) [16])(local_5d0.ray + 0x80) = auVar13;
                    }
                    auVar107._8_8_ = 0x100000001;
                    auVar107._0_8_ = 0x100000001;
                    if ((auVar107 & auVar12) != (undefined1  [16])0x0) {
                      pRVar76 = (RTCIntersectArguments *)0x1;
                      goto LAB_010ff345;
                    }
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar73;
                    uVar22 = uVar77 & 0x3f;
                    uVar77 = 0;
                    uVar79 = uVar79 ^ 1L << uVar22;
                    for (uVar22 = uVar79; pGVar75 = (Geometry *)local_6a0._0_8_, (uVar22 & 1) == 0;
                        uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                      uVar77 = uVar77 + 1;
                    }
                  }
                  pRVar76 = (RTCIntersectArguments *)0x0;
LAB_010ff345:
                  auVar191 = ZEXT3264(local_6c0);
                  auVar185 = ZEXT3264(local_720);
                  auVar116 = ZEXT3264(local_680);
                  auVar204 = ZEXT3264(local_6e0);
                  auVar175 = ZEXT3264(CONCAT428(fStack_644,
                                                CONCAT424(fStack_648,
                                                          CONCAT420(fStack_64c,
                                                                    CONCAT416(fStack_650,
                                                                              CONCAT412(fStack_654,
                                                                                        CONCAT48(
                                                  fStack_658,CONCAT44(fStack_65c,local_660))))))));
                  auVar169 = ZEXT3264(CONCAT428(fVar141,CONCAT424(fVar133,CONCAT420(fVar141,
                                                  CONCAT416(fVar133,CONCAT412(fVar141,CONCAT48(
                                                  fVar133,uVar83)))))));
                  auVar198 = ZEXT3264(local_700);
                  uVar77 = (ulong)(uint)local_560._0_4_;
                }
              }
              uVar77 = CONCAT71((int7)(uVar77 >> 8),(byte)uVar77 | (byte)pRVar76);
            }
          }
        }
        auVar140 = ZEXT3264(local_620);
      }
    }
    if ((uVar77 & 1) != 0) break;
    uVar73 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar88._4_4_ = uVar73;
    auVar88._0_4_ = uVar73;
    auVar88._8_4_ = uVar73;
    auVar88._12_4_ = uVar73;
    auVar12 = vcmpps_avx(local_2a0,auVar88,2);
    uVar78 = vmovmskps_avx(auVar12);
  }
  return local_4e8 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }